

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_hn<embree::sse2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  long lVar28;
  long lVar29;
  __int_type_conflict _Var30;
  long lVar31;
  long lVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined3 uVar43;
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined6 uVar70;
  undefined1 auVar71 [12];
  unkbyte9 Var72;
  undefined1 auVar73 [13];
  undefined1 auVar74 [12];
  undefined1 auVar75 [13];
  undefined1 auVar76 [12];
  undefined1 auVar77 [13];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [15];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  bool bVar96;
  bool bVar97;
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [13];
  undefined1 auVar103 [15];
  bool bVar104;
  byte bVar105;
  uint uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  RTCFilterFunctionN p_Var110;
  RTCRayN *pRVar111;
  byte bVar112;
  long lVar113;
  long lVar114;
  RayK<4> *pRVar115;
  uint uVar116;
  uint uVar117;
  uint uVar118;
  uint uVar119;
  uint uVar120;
  short sVar121;
  undefined2 uVar165;
  float fVar122;
  undefined1 auVar123 [12];
  float fVar166;
  vfloat_impl<4> p00;
  float fVar167;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar131 [16];
  undefined1 auVar124 [12];
  undefined1 auVar135 [16];
  undefined1 auVar139 [16];
  undefined1 auVar142 [16];
  undefined1 auVar145 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar168;
  undefined2 uVar200;
  float fVar201;
  undefined2 uVar202;
  float fVar203;
  undefined1 auVar169 [16];
  undefined1 auVar172 [16];
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  char cVar204;
  int iVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar209 [12];
  char cVar234;
  int iVar235;
  vfloat4 a_1;
  undefined1 auVar211 [16];
  char cVar239;
  undefined1 auVar215 [16];
  undefined1 auVar219 [16];
  undefined1 auVar210 [12];
  undefined1 auVar223 [16];
  float fVar238;
  float fVar240;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar241;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar242;
  float fVar243;
  float fVar251;
  float fVar253;
  undefined1 auVar246 [16];
  float fVar252;
  float fVar254;
  float fVar255;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar272;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar261 [16];
  float fVar273;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar274;
  char cVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar275 [16];
  float fVar288;
  float fVar289;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar290;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar291 [16];
  undefined1 auVar298 [12];
  float fVar312;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar304 [16];
  float fVar313;
  float fVar314;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar356;
  float fVar360;
  undefined1 auVar345 [16];
  undefined1 auVar348 [16];
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar375;
  float fVar378;
  vfloat4 a;
  undefined1 auVar369 [16];
  float fVar376;
  float fVar377;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar393;
  float fVar397;
  vfloat4 a_2;
  undefined1 auVar388 [16];
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar398;
  float fVar399;
  float fVar400;
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar412;
  float fVar413;
  float fVar416;
  float fVar417;
  float fVar420;
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  float fVar414;
  float fVar418;
  undefined1 auVar408 [16];
  float fVar415;
  float fVar419;
  float fVar421;
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  float fVar422;
  float fVar423;
  float fVar424;
  float fVar430;
  float fVar432;
  undefined1 auVar425 [16];
  float fVar431;
  float fVar433;
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  float fVar434;
  float fVar438;
  float fVar439;
  float fVar440;
  float fVar441;
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  float fVar442;
  float fVar443;
  float fVar449;
  float fVar451;
  undefined1 auVar444 [16];
  float fVar453;
  undefined1 auVar447 [16];
  float fVar450;
  float fVar452;
  float fVar454;
  undefined1 auVar448 [16];
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  BBox1f local_518;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  undefined1 local_3a8 [16];
  undefined1 (*local_398) [16];
  Primitive *local_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar129 [16];
  undefined1 auVar133 [16];
  undefined1 auVar137 [16];
  undefined1 auVar130 [16];
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 uVar164;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar208 [12];
  undefined1 auVar216 [16];
  undefined1 auVar220 [16];
  undefined1 auVar224 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  int iVar236;
  int iVar237;
  undefined1 auVar244 [12];
  undefined1 auVar247 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  
  PVar18 = prim[1];
  uVar107 = (ulong)(byte)PVar18;
  lVar113 = uVar107 * 0x25;
  uVar7 = *(undefined4 *)(prim + uVar107 * 4 + 6);
  uVar19 = *(undefined4 *)(prim + uVar107 * 5 + 6);
  uVar20 = *(undefined4 *)(prim + uVar107 * 6 + 6);
  uVar21 = *(undefined4 *)(prim + uVar107 * 0xf + 6);
  uVar22 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar23 = *(undefined4 *)(prim + uVar107 * 0x11 + 6);
  uVar24 = *(undefined4 *)(prim + uVar107 * 0x1a + 6);
  uVar25 = *(undefined4 *)(prim + uVar107 * 0x1b + 6);
  pPVar5 = prim + lVar113 + 6;
  fVar416 = *(float *)(pPVar5 + 0xc);
  fVar168 = (*(float *)(ray + k * 4) - *(float *)pPVar5) * fVar416;
  fVar201 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar5 + 4)) * fVar416;
  fVar203 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar5 + 8)) * fVar416;
  fVar401 = *(float *)(ray + k * 4 + 0x40) * fVar416;
  fVar412 = *(float *)(ray + k * 4 + 0x50) * fVar416;
  fVar416 = *(float *)(ray + k * 4 + 0x60) * fVar416;
  uVar164 = (undefined1)((uint)uVar19 >> 0x18);
  uVar165 = CONCAT11(uVar164,uVar164);
  uVar164 = (undefined1)((uint)uVar19 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar165,uVar164),CONCAT14(uVar164,uVar19));
  cVar234 = (char)((uint)uVar19 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),cVar234),cVar234);
  cVar204 = (char)uVar19;
  uVar109 = CONCAT62(uVar70,CONCAT11(cVar204,cVar204));
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar109;
  auVar213._12_2_ = uVar165;
  auVar213._14_2_ = uVar165;
  uVar165 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar109;
  auVar212._10_2_ = uVar165;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar165;
  auVar211._0_8_ = uVar109;
  uVar165 = (undefined2)uVar70;
  auVar71._4_8_ = auVar211._8_8_;
  auVar71._2_2_ = uVar165;
  auVar71._0_2_ = uVar165;
  iVar205 = (int)CONCAT11(cVar204,cVar204) >> 8;
  iVar235 = auVar71._0_4_ >> 0x18;
  auVar208._0_8_ = CONCAT44(iVar235,iVar205);
  auVar208._8_4_ = auVar211._8_4_ >> 0x18;
  auVar214._12_4_ = auVar212._12_4_ >> 0x18;
  auVar214._0_12_ = auVar208;
  fVar292 = (float)iVar235;
  cVar239 = cVar234 >> 7;
  auVar46[0xd] = 0;
  auVar46._0_13_ = auVar214._0_13_;
  auVar46[0xe] = cVar239;
  auVar49[0xc] = cVar239;
  auVar49._0_12_ = auVar208;
  auVar49._13_2_ = auVar46._13_2_;
  auVar52[0xb] = 0;
  auVar52._0_11_ = auVar208._0_11_;
  auVar52._12_3_ = auVar49._12_3_;
  auVar55[10] = cVar239;
  auVar55._0_10_ = auVar208._0_10_;
  auVar55._11_4_ = auVar52._11_4_;
  auVar58[9] = 0;
  auVar58._0_9_ = auVar208._0_9_;
  auVar58._10_5_ = auVar55._10_5_;
  auVar61[8] = cVar234;
  auVar61._0_8_ = auVar208._0_8_;
  auVar61._9_6_ = auVar58._9_6_;
  Var72 = CONCAT81(CONCAT71(auVar61._8_7_,(char)((uint)uVar20 >> 0x18)),(short)cVar204 >> 7);
  auVar64._6_9_ = Var72;
  auVar64[5] = (char)((uint)uVar20 >> 0x10);
  auVar64[4] = (undefined1)((short)cVar204 >> 7);
  auVar64._0_4_ = iVar205;
  cVar239 = (char)((uint)uVar20 >> 8);
  auVar73._2_11_ = auVar64._4_11_;
  auVar73[1] = cVar239;
  auVar73[0] = (undefined1)((short)cVar204 >> 7);
  cVar234 = (char)uVar20;
  auVar67._2_13_ = auVar73;
  auVar67._0_2_ = CONCAT11(cVar234,cVar204);
  uVar165 = (undefined2)Var72;
  auVar217._0_12_ = auVar67._0_12_;
  auVar217._12_2_ = uVar165;
  auVar217._14_2_ = uVar165;
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._0_10_ = auVar67._0_10_;
  auVar216._10_2_ = auVar64._4_2_;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._0_8_ = auVar67._0_8_;
  auVar215._8_2_ = auVar64._4_2_;
  auVar74._4_8_ = auVar215._8_8_;
  auVar74._2_2_ = auVar73._0_2_;
  auVar74._0_2_ = auVar73._0_2_;
  iVar235 = (int)CONCAT11(cVar234,cVar204) >> 8;
  iVar236 = auVar74._0_4_ >> 0x18;
  auVar209._0_8_ = CONCAT44(iVar236,iVar235);
  auVar209._8_4_ = auVar215._8_4_ >> 0x18;
  auVar218._12_4_ = auVar216._12_4_ >> 0x18;
  auVar218._0_12_ = auVar209;
  fVar393 = (float)iVar236;
  cVar204 = cVar239 >> 7;
  auVar47[0xd] = 0;
  auVar47._0_13_ = auVar218._0_13_;
  auVar47[0xe] = cVar204;
  auVar50[0xc] = cVar204;
  auVar50._0_12_ = auVar209;
  auVar50._13_2_ = auVar47._13_2_;
  auVar53[0xb] = 0;
  auVar53._0_11_ = auVar209._0_11_;
  auVar53._12_3_ = auVar50._12_3_;
  auVar56[10] = cVar204;
  auVar56._0_10_ = auVar209._0_10_;
  auVar56._11_4_ = auVar53._11_4_;
  auVar59[9] = 0;
  auVar59._0_9_ = auVar209._0_9_;
  auVar59._10_5_ = auVar56._10_5_;
  auVar62[8] = cVar239;
  auVar62._0_8_ = auVar209._0_8_;
  auVar62._9_6_ = auVar59._9_6_;
  Var72 = CONCAT81(CONCAT71(auVar62._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar234 >> 7);
  auVar65._6_9_ = Var72;
  auVar65[5] = (char)((uint)uVar22 >> 0x10);
  auVar65[4] = (undefined1)((short)cVar234 >> 7);
  auVar65._0_4_ = iVar235;
  cVar285 = (char)((uint)uVar22 >> 8);
  auVar75._2_11_ = auVar65._4_11_;
  auVar75[1] = cVar285;
  auVar75[0] = (undefined1)((short)cVar234 >> 7);
  cVar239 = (char)uVar22;
  auVar68._2_13_ = auVar75;
  auVar68._0_2_ = CONCAT11(cVar239,cVar234);
  uVar165 = (undefined2)Var72;
  auVar221._0_12_ = auVar68._0_12_;
  auVar221._12_2_ = uVar165;
  auVar221._14_2_ = uVar165;
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._0_10_ = auVar68._0_10_;
  auVar220._10_2_ = auVar65._4_2_;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._0_8_ = auVar68._0_8_;
  auVar219._8_2_ = auVar65._4_2_;
  auVar76._4_8_ = auVar219._8_8_;
  auVar76._2_2_ = auVar75._0_2_;
  auVar76._0_2_ = auVar75._0_2_;
  iVar236 = (int)CONCAT11(cVar239,cVar234) >> 8;
  iVar237 = auVar76._0_4_ >> 0x18;
  auVar210._0_8_ = CONCAT44(iVar237,iVar236);
  auVar210._8_4_ = auVar219._8_4_ >> 0x18;
  auVar222._12_4_ = auVar220._12_4_ >> 0x18;
  auVar222._0_12_ = auVar210;
  fVar312 = (float)iVar237;
  cVar204 = cVar285 >> 7;
  auVar48[0xd] = 0;
  auVar48._0_13_ = auVar222._0_13_;
  auVar48[0xe] = cVar204;
  auVar51[0xc] = cVar204;
  auVar51._0_12_ = auVar210;
  auVar51._13_2_ = auVar48._13_2_;
  auVar54[0xb] = 0;
  auVar54._0_11_ = auVar210._0_11_;
  auVar54._12_3_ = auVar51._12_3_;
  auVar57[10] = cVar204;
  auVar57._0_10_ = auVar210._0_10_;
  auVar57._11_4_ = auVar54._11_4_;
  auVar60[9] = 0;
  auVar60._0_9_ = auVar210._0_9_;
  auVar60._10_5_ = auVar57._10_5_;
  auVar63[8] = cVar285;
  auVar63._0_8_ = auVar210._0_8_;
  auVar63._9_6_ = auVar60._9_6_;
  Var72 = CONCAT81(CONCAT71(auVar63._8_7_,(char)((uint)uVar23 >> 0x18)),(short)cVar239 >> 7);
  auVar66._6_9_ = Var72;
  auVar66[5] = (char)((uint)uVar23 >> 0x10);
  auVar66[4] = (undefined1)((short)cVar239 >> 7);
  auVar66._0_4_ = iVar236;
  auVar77._2_11_ = auVar66._4_11_;
  auVar77[1] = (char)((uint)uVar23 >> 8);
  auVar77[0] = (undefined1)((short)cVar239 >> 7);
  sVar121 = CONCAT11((char)uVar23,cVar239);
  auVar69._2_13_ = auVar77;
  auVar69._0_2_ = sVar121;
  uVar165 = (undefined2)Var72;
  auVar225._0_12_ = auVar69._0_12_;
  auVar225._12_2_ = uVar165;
  auVar225._14_2_ = uVar165;
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._0_10_ = auVar69._0_10_;
  auVar224._10_2_ = auVar66._4_2_;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._0_8_ = auVar69._0_8_;
  auVar223._8_2_ = auVar66._4_2_;
  auVar78._4_8_ = auVar223._8_8_;
  auVar78._2_2_ = auVar77._0_2_;
  auVar78._0_2_ = auVar77._0_2_;
  fVar315 = (float)((int)sVar121 >> 8);
  fVar327 = (float)(auVar78._0_4_ >> 0x18);
  fVar333 = (float)(auVar223._8_4_ >> 0x18);
  uVar19 = *(undefined4 *)(prim + uVar107 * 0x1c + 6);
  fVar242 = fVar416 * fVar315;
  fVar251 = fVar416 * fVar327;
  auVar244._0_8_ = CONCAT44(fVar251,fVar242);
  auVar244._8_4_ = fVar416 * fVar333;
  auVar245._12_4_ = fVar416 * (float)(auVar224._12_4_ >> 0x18);
  auVar245._0_12_ = auVar244;
  fVar206 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar113 + 0x16)) *
            *(float *)(prim + lVar113 + 0x1a);
  local_538[0] = (undefined1)uVar7;
  local_538[1] = (undefined1)((uint)uVar7 >> 8);
  local_538[2] = (undefined1)((uint)uVar7 >> 0x10);
  local_538[3] = (undefined1)((uint)uVar7 >> 0x18);
  auVar91[0xd] = 0;
  auVar91._0_13_ = auVar245._0_13_;
  auVar91[0xe] = (char)((uint)fVar251 >> 0x18);
  auVar94[0xc] = (char)((uint)fVar251 >> 0x10);
  auVar94._0_12_ = auVar244;
  auVar94._13_2_ = auVar91._13_2_;
  auVar95[0xb] = 0;
  auVar95._0_11_ = auVar244._0_11_;
  auVar95._12_3_ = auVar94._12_3_;
  auVar98[10] = (char)((uint)fVar251 >> 8);
  auVar98._0_10_ = auVar244._0_10_;
  auVar98._11_4_ = auVar95._11_4_;
  auVar99[9] = 0;
  auVar99._0_9_ = auVar244._0_9_;
  auVar99._10_5_ = auVar98._10_5_;
  auVar100[8] = SUB41(fVar251,0);
  auVar100._0_8_ = auVar244._0_8_;
  auVar100._9_6_ = auVar99._9_6_;
  Var72 = CONCAT81(CONCAT71(auVar100._8_7_,local_538[3]),(char)((uint)fVar242 >> 0x18));
  auVar101._6_9_ = Var72;
  auVar101[5] = local_538[2];
  auVar101[4] = (char)((uint)fVar242 >> 0x10);
  auVar101._0_4_ = fVar242;
  auVar102._2_11_ = auVar101._4_11_;
  auVar102[1] = local_538[1];
  auVar102[0] = (char)((uint)fVar242 >> 8);
  sVar121 = CONCAT11(local_538[0],SUB41(fVar242,0));
  auVar103._2_13_ = auVar102;
  auVar103._0_2_ = sVar121;
  uVar165 = (undefined2)Var72;
  auVar248._0_12_ = auVar103._0_12_;
  auVar248._12_2_ = uVar165;
  auVar248._14_2_ = uVar165;
  auVar247._12_4_ = auVar248._12_4_;
  auVar247._0_10_ = auVar103._0_10_;
  auVar247._10_2_ = auVar101._4_2_;
  auVar246._10_6_ = auVar247._10_6_;
  auVar246._0_8_ = auVar103._0_8_;
  auVar246._8_2_ = auVar101._4_2_;
  auVar79._4_8_ = auVar246._8_8_;
  auVar79._2_2_ = auVar102._0_2_;
  auVar79._0_2_ = auVar102._0_2_;
  fVar243 = (float)((int)sVar121 >> 8);
  fVar252 = (float)(auVar79._0_4_ >> 0x18);
  fVar253 = (float)(auVar246._8_4_ >> 0x18);
  uVar164 = (undefined1)((uint)uVar21 >> 0x18);
  uVar165 = CONCAT11(uVar164,uVar164);
  uVar164 = (undefined1)((uint)uVar21 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar165,uVar164),CONCAT14(uVar164,uVar21));
  uVar164 = (undefined1)((uint)uVar21 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar164),uVar164);
  sVar121 = CONCAT11((char)uVar21,(char)uVar21);
  uVar109 = CONCAT62(uVar70,sVar121);
  auVar126._8_4_ = 0;
  auVar126._0_8_ = uVar109;
  auVar126._12_2_ = uVar165;
  auVar126._14_2_ = uVar165;
  uVar165 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar256._12_4_ = auVar126._12_4_;
  auVar256._8_2_ = 0;
  auVar256._0_8_ = uVar109;
  auVar256._10_2_ = uVar165;
  auVar185._10_6_ = auVar256._10_6_;
  auVar185._8_2_ = uVar165;
  auVar185._0_8_ = uVar109;
  uVar165 = (undefined2)uVar70;
  auVar80._4_8_ = auVar185._8_8_;
  auVar80._2_2_ = uVar165;
  auVar80._0_2_ = uVar165;
  fVar207 = (float)((int)sVar121 >> 8);
  fVar238 = (float)(auVar80._0_4_ >> 0x18);
  fVar240 = (float)(auVar185._8_4_ >> 0x18);
  uVar164 = (undefined1)((uint)uVar24 >> 0x18);
  uVar165 = CONCAT11(uVar164,uVar164);
  uVar164 = (undefined1)((uint)uVar24 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar165,uVar164),CONCAT14(uVar164,uVar24));
  uVar164 = (undefined1)((uint)uVar24 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar164),uVar164);
  sVar121 = CONCAT11((char)uVar24,(char)uVar24);
  uVar109 = CONCAT62(uVar70,sVar121);
  auVar427._8_4_ = 0;
  auVar427._0_8_ = uVar109;
  auVar427._12_2_ = uVar165;
  auVar427._14_2_ = uVar165;
  uVar165 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar426._12_4_ = auVar427._12_4_;
  auVar426._8_2_ = 0;
  auVar426._0_8_ = uVar109;
  auVar426._10_2_ = uVar165;
  auVar425._10_6_ = auVar426._10_6_;
  auVar425._8_2_ = uVar165;
  auVar425._0_8_ = uVar109;
  uVar165 = (undefined2)uVar70;
  auVar81._4_8_ = auVar425._8_8_;
  auVar81._2_2_ = uVar165;
  auVar81._0_2_ = uVar165;
  fVar422 = (float)((int)sVar121 >> 8);
  fVar430 = (float)(auVar81._0_4_ >> 0x18);
  fVar432 = (float)(auVar425._8_4_ >> 0x18);
  uVar164 = (undefined1)((uint)uVar25 >> 0x18);
  uVar165 = CONCAT11(uVar164,uVar164);
  uVar164 = (undefined1)((uint)uVar25 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar165,uVar164),CONCAT14(uVar164,uVar25));
  uVar164 = (undefined1)((uint)uVar25 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar164),uVar164);
  sVar121 = CONCAT11((char)uVar25,(char)uVar25);
  uVar109 = CONCAT62(uVar70,sVar121);
  auVar347._8_4_ = 0;
  auVar347._0_8_ = uVar109;
  auVar347._12_2_ = uVar165;
  auVar347._14_2_ = uVar165;
  uVar165 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar346._12_4_ = auVar347._12_4_;
  auVar346._8_2_ = 0;
  auVar346._0_8_ = uVar109;
  auVar346._10_2_ = uVar165;
  auVar345._10_6_ = auVar346._10_6_;
  auVar345._8_2_ = uVar165;
  auVar345._0_8_ = uVar109;
  uVar165 = (undefined2)uVar70;
  auVar82._4_8_ = auVar345._8_8_;
  auVar82._2_2_ = uVar165;
  auVar82._0_2_ = uVar165;
  fVar341 = (float)((int)sVar121 >> 8);
  fVar356 = (float)(auVar82._0_4_ >> 0x18);
  fVar360 = (float)(auVar345._8_4_ >> 0x18);
  uVar164 = (undefined1)((uint)uVar19 >> 0x18);
  uVar165 = CONCAT11(uVar164,uVar164);
  uVar164 = (undefined1)((uint)uVar19 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar165,uVar164),CONCAT14(uVar164,uVar19));
  uVar164 = (undefined1)((uint)uVar19 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar164),uVar164);
  sVar121 = CONCAT11((char)uVar19,(char)uVar19);
  uVar109 = CONCAT62(uVar70,sVar121);
  auVar446._8_4_ = 0;
  auVar446._0_8_ = uVar109;
  auVar446._12_2_ = uVar165;
  auVar446._14_2_ = uVar165;
  uVar165 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar445._12_4_ = auVar446._12_4_;
  auVar445._8_2_ = 0;
  auVar445._0_8_ = uVar109;
  auVar445._10_2_ = uVar165;
  auVar444._10_6_ = auVar445._10_6_;
  auVar444._8_2_ = uVar165;
  auVar444._0_8_ = uVar109;
  uVar165 = (undefined2)uVar70;
  auVar83._4_8_ = auVar444._8_8_;
  auVar83._2_2_ = uVar165;
  auVar83._0_2_ = uVar165;
  fVar122 = (float)((int)sVar121 >> 8);
  fVar166 = (float)(auVar83._0_4_ >> 0x18);
  fVar167 = (float)(auVar444._8_4_ >> 0x18);
  fVar442 = fVar401 * fVar243 + fVar412 * (float)iVar205 + fVar416 * (float)iVar235;
  fVar449 = fVar401 * fVar252 + fVar412 * fVar292 + fVar416 * fVar393;
  fVar451 = fVar401 * fVar253 + fVar412 * (float)auVar208._8_4_ + fVar416 * (float)auVar209._8_4_;
  fVar453 = fVar401 * (float)(auVar247._12_4_ >> 0x18) +
            fVar412 * (float)auVar214._12_4_ + fVar416 * (float)auVar218._12_4_;
  fVar402 = fVar401 * fVar207 + fVar412 * (float)iVar236 + fVar242;
  fVar413 = fVar401 * fVar238 + fVar412 * fVar312 + fVar251;
  fVar417 = fVar401 * fVar240 + fVar412 * (float)auVar210._8_4_ + auVar244._8_4_;
  fVar420 = fVar401 * (float)(auVar256._12_4_ >> 0x18) +
            fVar412 * (float)auVar222._12_4_ + auVar245._12_4_;
  fVar242 = fVar401 * fVar422 + fVar412 * fVar341 + fVar416 * fVar122;
  fVar251 = fVar401 * fVar430 + fVar412 * fVar356 + fVar416 * fVar166;
  fVar287 = fVar401 * fVar432 + fVar412 * fVar360 + fVar416 * fVar167;
  fVar401 = fVar401 * (float)(auVar426._12_4_ >> 0x18) +
            fVar412 * (float)(auVar346._12_4_ >> 0x18) + fVar416 * (float)(auVar445._12_4_ >> 0x18);
  uVar8 = *(undefined8 *)(prim + uVar107 * 7 + 6);
  uVar9 = *(undefined8 *)(prim + uVar107 * 0xb + 6);
  uVar10 = *(undefined8 *)(prim + uVar107 * 9 + 6);
  uVar11 = *(undefined8 *)(prim + uVar107 * 0xd + 6);
  uVar109 = *(ulong *)(prim + uVar107 * 0x12 + 6);
  fVar412 = fVar243 * fVar168 + (float)iVar205 * fVar201 + (float)iVar235 * fVar203;
  fVar393 = fVar252 * fVar168 + fVar292 * fVar201 + fVar393 * fVar203;
  fVar254 = fVar253 * fVar168 + (float)auVar208._8_4_ * fVar201 + (float)auVar209._8_4_ * fVar203;
  fVar255 = (float)(auVar247._12_4_ >> 0x18) * fVar168 +
            (float)auVar214._12_4_ * fVar201 + (float)auVar218._12_4_ * fVar203;
  fVar292 = fVar207 * fVar168 + (float)iVar236 * fVar201 + fVar315 * fVar203;
  fVar312 = fVar238 * fVar168 + fVar312 * fVar201 + fVar327 * fVar203;
  fVar315 = fVar240 * fVar168 + (float)auVar210._8_4_ * fVar201 + fVar333 * fVar203;
  fVar327 = (float)(auVar256._12_4_ >> 0x18) * fVar168 +
            (float)auVar222._12_4_ * fVar201 + (float)(auVar224._12_4_ >> 0x18) * fVar203;
  fVar422 = fVar168 * fVar422 + fVar201 * fVar341 + fVar203 * fVar122;
  fVar430 = fVar168 * fVar430 + fVar201 * fVar356 + fVar203 * fVar166;
  fVar432 = fVar168 * fVar432 + fVar201 * fVar360 + fVar203 * fVar167;
  fVar440 = fVar168 * (float)(auVar426._12_4_ >> 0x18) +
            fVar201 * (float)(auVar346._12_4_ >> 0x18) + fVar203 * (float)(auVar445._12_4_ >> 0x18);
  fVar416 = (float)DAT_01f4bd50;
  fVar122 = DAT_01f4bd50._4_4_;
  fVar166 = DAT_01f4bd50._8_4_;
  fVar167 = DAT_01f4bd50._12_4_;
  uVar117 = -(uint)(fVar416 <= ABS(fVar442));
  uVar118 = -(uint)(fVar122 <= ABS(fVar449));
  uVar119 = -(uint)(fVar166 <= ABS(fVar451));
  uVar120 = -(uint)(fVar167 <= ABS(fVar453));
  auVar447._0_4_ = (uint)fVar442 & uVar117;
  auVar447._4_4_ = (uint)fVar449 & uVar118;
  auVar447._8_4_ = (uint)fVar451 & uVar119;
  auVar447._12_4_ = (uint)fVar453 & uVar120;
  auVar125._0_4_ = ~uVar117 & (uint)fVar416;
  auVar125._4_4_ = ~uVar118 & (uint)fVar122;
  auVar125._8_4_ = ~uVar119 & (uint)fVar166;
  auVar125._12_4_ = ~uVar120 & (uint)fVar167;
  auVar125 = auVar125 | auVar447;
  uVar117 = -(uint)(fVar416 <= ABS(fVar402));
  uVar118 = -(uint)(fVar122 <= ABS(fVar413));
  uVar119 = -(uint)(fVar166 <= ABS(fVar417));
  uVar120 = -(uint)(fVar167 <= ABS(fVar420));
  auVar405._0_4_ = (uint)fVar402 & uVar117;
  auVar405._4_4_ = (uint)fVar413 & uVar118;
  auVar405._8_4_ = (uint)fVar417 & uVar119;
  auVar405._12_4_ = (uint)fVar420 & uVar120;
  auVar299._0_4_ = ~uVar117 & (uint)fVar416;
  auVar299._4_4_ = ~uVar118 & (uint)fVar122;
  auVar299._8_4_ = ~uVar119 & (uint)fVar166;
  auVar299._12_4_ = ~uVar120 & (uint)fVar167;
  auVar299 = auVar299 | auVar405;
  uVar117 = -(uint)(fVar416 <= ABS(fVar242));
  uVar118 = -(uint)(fVar122 <= ABS(fVar251));
  uVar119 = -(uint)(fVar166 <= ABS(fVar287));
  uVar120 = -(uint)(fVar167 <= ABS(fVar401));
  auVar275._0_4_ = (uint)fVar242 & uVar117;
  auVar275._4_4_ = (uint)fVar251 & uVar118;
  auVar275._8_4_ = (uint)fVar287 & uVar119;
  auVar275._12_4_ = (uint)fVar401 & uVar120;
  auVar406._0_4_ = ~uVar117 & (uint)fVar416;
  auVar406._4_4_ = ~uVar118 & (uint)fVar122;
  auVar406._8_4_ = ~uVar119 & (uint)fVar166;
  auVar406._12_4_ = ~uVar120 & (uint)fVar167;
  auVar406 = auVar406 | auVar275;
  auVar256 = rcpps(_DAT_01f4bd50,auVar125);
  auVar257._0_4_ = auVar256._0_4_;
  auVar350._0_4_ = auVar125._0_4_ * auVar257._0_4_;
  fVar333 = auVar256._4_4_;
  auVar350._4_4_ = auVar125._4_4_ * fVar333;
  fVar341 = auVar256._8_4_;
  auVar350._8_4_ = auVar125._8_4_ * fVar341;
  fVar356 = auVar256._12_4_;
  auVar350._12_4_ = auVar125._12_4_ * fVar356;
  fVar402 = (1.0 - auVar350._0_4_) * auVar257._0_4_ + auVar257._0_4_;
  fVar333 = (1.0 - auVar350._4_4_) * fVar333 + fVar333;
  fVar341 = (1.0 - auVar350._8_4_) * fVar341 + fVar341;
  fVar356 = (1.0 - auVar350._12_4_) * fVar356 + fVar356;
  auVar126 = rcpps(auVar350,auVar299);
  fVar416 = auVar126._0_4_;
  auVar300._0_4_ = auVar299._0_4_ * fVar416;
  fVar122 = auVar126._4_4_;
  fVar201 = auVar299._4_4_ * fVar122;
  auVar298._0_8_ = CONCAT44(fVar201,auVar300._0_4_);
  fVar240 = auVar126._8_4_;
  auVar298._8_4_ = auVar299._8_4_ * fVar240;
  fVar287 = auVar126._12_4_;
  fVar416 = (1.0 - auVar300._0_4_) * fVar416 + fVar416;
  fVar122 = (1.0 - fVar201) * fVar122 + fVar122;
  fVar240 = (1.0 - auVar298._8_4_) * fVar240 + fVar240;
  fVar287 = (1.0 - auVar299._12_4_ * fVar287) * fVar287 + fVar287;
  auVar126 = rcpps(auVar126,auVar406);
  auVar127._0_4_ = auVar126._0_4_;
  fVar166 = auVar126._4_4_;
  fVar242 = auVar126._8_4_;
  fVar401 = auVar126._12_4_;
  uVar12 = *(undefined8 *)(prim + uVar107 * 0x16 + 6);
  fVar360 = (1.0 - auVar406._0_4_ * auVar127._0_4_) * auVar127._0_4_ + auVar127._0_4_;
  fVar166 = (1.0 - auVar406._4_4_ * fVar166) * fVar166 + fVar166;
  fVar242 = (1.0 - auVar406._8_4_ * fVar242) * fVar242 + fVar242;
  fVar401 = (1.0 - auVar406._12_4_ * fVar401) * fVar401 + fVar401;
  local_518.lower._0_2_ = (short)uVar8;
  local_518.lower._2_2_ = (undefined2)((ulong)uVar8 >> 0x10);
  local_518.upper._0_2_ = (undefined2)((ulong)uVar8 >> 0x20);
  local_518.upper._2_2_ = (undefined2)((ulong)uVar8 >> 0x30);
  auVar130._0_12_ = auVar126._0_12_;
  auVar130._12_2_ = auVar126._6_2_;
  auVar130._14_2_ = local_518.upper._2_2_;
  auVar129._12_4_ = auVar130._12_4_;
  auVar129._0_10_ = auVar126._0_10_;
  auVar129._10_2_ = local_518.upper._0_2_;
  auVar128._10_6_ = auVar129._10_6_;
  auVar128._0_8_ = auVar126._0_8_;
  auVar128._8_2_ = auVar126._4_2_;
  auVar127._8_8_ = auVar128._8_8_;
  auVar127._6_2_ = local_518.lower._2_2_;
  auVar127._4_2_ = auVar126._2_2_;
  auVar131._0_4_ = (float)(int)local_518.lower._0_2_;
  fVar167 = (float)(auVar127._4_4_ >> 0x10);
  auVar123._0_8_ = CONCAT44(fVar167,auVar131._0_4_);
  auVar123._8_4_ = (float)(auVar128._8_4_ >> 0x10);
  auVar260._0_12_ = auVar256._0_12_;
  auVar260._12_2_ = auVar256._6_2_;
  auVar260._14_2_ = (short)((ulong)uVar9 >> 0x30);
  auVar259._12_4_ = auVar260._12_4_;
  auVar259._0_10_ = auVar256._0_10_;
  auVar259._10_2_ = (short)((ulong)uVar9 >> 0x20);
  auVar258._10_6_ = auVar259._10_6_;
  auVar258._0_8_ = auVar256._0_8_;
  auVar258._8_2_ = auVar256._4_2_;
  auVar257._8_8_ = auVar258._8_8_;
  auVar257._6_2_ = (short)((ulong)uVar9 >> 0x10);
  auVar257._4_2_ = auVar256._2_2_;
  auVar134._12_2_ = (short)((uint)fVar167 >> 0x10);
  auVar134._0_12_ = auVar123;
  auVar134._14_2_ = (short)((ulong)uVar10 >> 0x30);
  auVar133._12_4_ = auVar134._12_4_;
  auVar133._0_10_ = auVar123._0_10_;
  auVar133._10_2_ = (short)((ulong)uVar10 >> 0x20);
  auVar132._10_6_ = auVar133._10_6_;
  auVar132._8_2_ = SUB42(fVar167,0);
  auVar132._0_8_ = auVar123._0_8_;
  auVar131._8_8_ = auVar132._8_8_;
  auVar131._6_2_ = (short)((ulong)uVar10 >> 0x10);
  auVar131._4_2_ = (short)((uint)auVar131._0_4_ >> 0x10);
  auVar135._0_4_ = (float)(int)(short)uVar10;
  fVar168 = (float)(auVar131._4_4_ >> 0x10);
  auVar124._0_8_ = CONCAT44(fVar168,auVar135._0_4_);
  auVar124._8_4_ = (float)(auVar132._8_4_ >> 0x10);
  auVar303._12_2_ = (short)((uint)fVar201 >> 0x10);
  auVar303._0_12_ = auVar298;
  auVar303._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar302._12_4_ = auVar303._12_4_;
  auVar302._0_10_ = auVar298._0_10_;
  auVar302._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar301._10_6_ = auVar302._10_6_;
  auVar301._8_2_ = SUB42(fVar201,0);
  auVar301._0_8_ = auVar298._0_8_;
  auVar300._8_8_ = auVar301._8_8_;
  auVar300._6_2_ = (short)((ulong)uVar11 >> 0x10);
  auVar300._4_2_ = (short)((uint)auVar300._0_4_ >> 0x10);
  uVar202 = (undefined2)(uVar109 >> 0x30);
  auVar138._12_2_ = (short)((uint)fVar168 >> 0x10);
  auVar138._0_12_ = auVar124;
  auVar138._14_2_ = uVar202;
  auVar137._12_4_ = auVar138._12_4_;
  auVar137._0_10_ = auVar124._0_10_;
  uVar200 = (undefined2)(uVar109 >> 0x20);
  auVar137._10_2_ = uVar200;
  auVar136._10_6_ = auVar137._10_6_;
  auVar136._8_2_ = SUB42(fVar168,0);
  auVar136._0_8_ = auVar124._0_8_;
  auVar135._8_8_ = auVar136._8_8_;
  uVar165 = (undefined2)(uVar109 >> 0x10);
  auVar135._6_2_ = uVar165;
  auVar135._4_2_ = (short)((uint)auVar135._0_4_ >> 0x10);
  fVar201 = (float)(auVar135._4_4_ >> 0x10);
  fVar243 = (float)(auVar136._8_4_ >> 0x10);
  auVar171._8_4_ = 0;
  auVar171._0_8_ = uVar109;
  auVar171._12_2_ = uVar202;
  auVar171._14_2_ = (short)((ulong)uVar12 >> 0x30);
  auVar170._12_4_ = auVar171._12_4_;
  auVar170._8_2_ = 0;
  auVar170._0_8_ = uVar109;
  auVar170._10_2_ = (short)((ulong)uVar12 >> 0x20);
  auVar169._10_6_ = auVar170._10_6_;
  auVar169._8_2_ = uVar200;
  auVar169._0_8_ = uVar109;
  auVar84._4_8_ = auVar169._8_8_;
  auVar84._2_2_ = (short)((ulong)uVar12 >> 0x10);
  auVar84._0_2_ = uVar165;
  uVar108 = *(ulong *)(prim + uVar107 * 0x14 + 6);
  uVar165 = (undefined2)(uVar108 >> 0x30);
  auVar141._8_4_ = 0;
  auVar141._0_8_ = uVar108;
  auVar141._12_2_ = uVar165;
  auVar141._14_2_ = uVar165;
  uVar165 = (undefined2)(uVar108 >> 0x20);
  auVar140._12_4_ = auVar141._12_4_;
  auVar140._8_2_ = 0;
  auVar140._0_8_ = uVar108;
  auVar140._10_2_ = uVar165;
  auVar139._10_6_ = auVar140._10_6_;
  auVar139._8_2_ = uVar165;
  auVar139._0_8_ = uVar108;
  uVar165 = (undefined2)(uVar108 >> 0x10);
  auVar85._4_8_ = auVar139._8_8_;
  auVar85._2_2_ = uVar165;
  auVar85._0_2_ = uVar165;
  fVar203 = (float)(auVar85._0_4_ >> 0x10);
  fVar251 = (float)(auVar139._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar107 * 0x18 + 6);
  uVar165 = (undefined2)(uVar13 >> 0x30);
  auVar174._8_4_ = 0;
  auVar174._0_8_ = uVar13;
  auVar174._12_2_ = uVar165;
  auVar174._14_2_ = uVar165;
  uVar165 = (undefined2)(uVar13 >> 0x20);
  auVar173._12_4_ = auVar174._12_4_;
  auVar173._8_2_ = 0;
  auVar173._0_8_ = uVar13;
  auVar173._10_2_ = uVar165;
  auVar172._10_6_ = auVar173._10_6_;
  auVar172._8_2_ = uVar165;
  auVar172._0_8_ = uVar13;
  uVar165 = (undefined2)(uVar13 >> 0x10);
  auVar86._4_8_ = auVar172._8_8_;
  auVar86._2_2_ = uVar165;
  auVar86._0_2_ = uVar165;
  uVar14 = *(ulong *)(prim + uVar107 * 0x1d + 6);
  uVar165 = (undefined2)(uVar14 >> 0x30);
  auVar144._8_4_ = 0;
  auVar144._0_8_ = uVar14;
  auVar144._12_2_ = uVar165;
  auVar144._14_2_ = uVar165;
  uVar165 = (undefined2)(uVar14 >> 0x20);
  auVar143._12_4_ = auVar144._12_4_;
  auVar143._8_2_ = 0;
  auVar143._0_8_ = uVar14;
  auVar143._10_2_ = uVar165;
  auVar142._10_6_ = auVar143._10_6_;
  auVar142._8_2_ = uVar165;
  auVar142._0_8_ = uVar14;
  uVar165 = (undefined2)(uVar14 >> 0x10);
  auVar87._4_8_ = auVar142._8_8_;
  auVar87._2_2_ = uVar165;
  auVar87._0_2_ = uVar165;
  fVar207 = (float)(auVar87._0_4_ >> 0x10);
  fVar252 = (float)(auVar142._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar107 * 0x21 + 6);
  uVar165 = (undefined2)(uVar15 >> 0x30);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar15;
  auVar177._12_2_ = uVar165;
  auVar177._14_2_ = uVar165;
  uVar165 = (undefined2)(uVar15 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar15;
  auVar176._10_2_ = uVar165;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar165;
  auVar175._0_8_ = uVar15;
  uVar165 = (undefined2)(uVar15 >> 0x10);
  auVar88._4_8_ = auVar175._8_8_;
  auVar88._2_2_ = uVar165;
  auVar88._0_2_ = uVar165;
  uVar16 = *(ulong *)(prim + uVar107 * 0x1f + 6);
  uVar165 = (undefined2)(uVar16 >> 0x30);
  auVar147._8_4_ = 0;
  auVar147._0_8_ = uVar16;
  auVar147._12_2_ = uVar165;
  auVar147._14_2_ = uVar165;
  uVar165 = (undefined2)(uVar16 >> 0x20);
  auVar146._12_4_ = auVar147._12_4_;
  auVar146._8_2_ = 0;
  auVar146._0_8_ = uVar16;
  auVar146._10_2_ = uVar165;
  auVar145._10_6_ = auVar146._10_6_;
  auVar145._8_2_ = uVar165;
  auVar145._0_8_ = uVar16;
  uVar165 = (undefined2)(uVar16 >> 0x10);
  auVar89._4_8_ = auVar145._8_8_;
  auVar89._2_2_ = uVar165;
  auVar89._0_2_ = uVar165;
  fVar238 = (float)(auVar89._0_4_ >> 0x10);
  fVar253 = (float)(auVar145._8_4_ >> 0x10);
  uVar17 = *(ulong *)(prim + uVar107 * 0x23 + 6);
  uVar165 = (undefined2)(uVar17 >> 0x30);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar17;
  auVar180._12_2_ = uVar165;
  auVar180._14_2_ = uVar165;
  uVar165 = (undefined2)(uVar17 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar17;
  auVar179._10_2_ = uVar165;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar165;
  auVar178._0_8_ = uVar17;
  uVar165 = (undefined2)(uVar17 >> 0x10);
  auVar90._4_8_ = auVar178._8_8_;
  auVar90._2_2_ = uVar165;
  auVar90._0_2_ = uVar165;
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar261._0_8_ =
       CONCAT44(((((float)(auVar257._4_4_ >> 0x10) - fVar167) * fVar206 + fVar167) - fVar393) *
                fVar333,((((float)(int)(short)uVar9 - auVar131._0_4_) * fVar206 + auVar131._0_4_) -
                        fVar412) * fVar402);
  auVar261._8_4_ =
       ((((float)(auVar258._8_4_ >> 0x10) - auVar123._8_4_) * fVar206 + auVar123._8_4_) - fVar254) *
       fVar341;
  auVar261._12_4_ =
       ((((float)(auVar259._12_4_ >> 0x10) - (float)(auVar129._12_4_ >> 0x10)) * fVar206 +
        (float)(auVar129._12_4_ >> 0x10)) - fVar255) * fVar356;
  auVar304._0_4_ =
       ((((float)(int)(short)uVar11 - auVar135._0_4_) * fVar206 + auVar135._0_4_) - fVar412) *
       fVar402;
  auVar304._4_4_ =
       ((((float)(auVar300._4_4_ >> 0x10) - fVar168) * fVar206 + fVar168) - fVar393) * fVar333;
  auVar304._8_4_ =
       ((((float)(auVar301._8_4_ >> 0x10) - auVar124._8_4_) * fVar206 + auVar124._8_4_) - fVar254) *
       fVar341;
  auVar304._12_4_ =
       ((((float)(auVar302._12_4_ >> 0x10) - (float)(auVar133._12_4_ >> 0x10)) * fVar206 +
        (float)(auVar133._12_4_ >> 0x10)) - fVar255) * fVar356;
  auVar348._0_8_ =
       CONCAT44(((((float)(auVar84._0_4_ >> 0x10) - fVar201) * fVar206 + fVar201) - fVar312) *
                fVar122,((((float)(int)(short)uVar12 - (float)(int)(short)uVar109) * fVar206 +
                         (float)(int)(short)uVar109) - fVar292) * fVar416);
  auVar348._8_4_ =
       ((((float)(auVar169._8_4_ >> 0x10) - fVar243) * fVar206 + fVar243) - fVar315) * fVar240;
  auVar348._12_4_ =
       ((((float)(auVar170._12_4_ >> 0x10) - (float)(auVar137._12_4_ >> 0x10)) * fVar206 +
        (float)(auVar137._12_4_ >> 0x10)) - fVar327) * fVar287;
  auVar369._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar108) * fVar206 +
        (float)(int)(short)uVar108) - fVar292) * fVar416;
  auVar369._4_4_ =
       ((((float)(auVar86._0_4_ >> 0x10) - fVar203) * fVar206 + fVar203) - fVar312) * fVar122;
  auVar369._8_4_ =
       ((((float)(auVar172._8_4_ >> 0x10) - fVar251) * fVar206 + fVar251) - fVar315) * fVar240;
  auVar369._12_4_ =
       ((((float)(auVar173._12_4_ >> 0x10) - (float)(auVar140._12_4_ >> 0x10)) * fVar206 +
        (float)(auVar140._12_4_ >> 0x10)) - fVar327) * fVar287;
  auVar388._0_8_ =
       CONCAT44(((((float)(auVar88._0_4_ >> 0x10) - fVar207) * fVar206 + fVar207) - fVar430) *
                fVar166,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar206 +
                         (float)(int)(short)uVar14) - fVar422) * fVar360);
  auVar388._8_4_ =
       ((((float)(auVar175._8_4_ >> 0x10) - fVar252) * fVar206 + fVar252) - fVar432) * fVar242;
  auVar388._12_4_ =
       ((((float)(auVar176._12_4_ >> 0x10) - (float)(auVar143._12_4_ >> 0x10)) * fVar206 +
        (float)(auVar143._12_4_ >> 0x10)) - fVar440) * fVar401;
  auVar407._0_4_ =
       ((((float)(int)(short)uVar17 - (float)(int)(short)uVar16) * fVar206 +
        (float)(int)(short)uVar16) - fVar422) * fVar360;
  auVar407._4_4_ =
       ((((float)(auVar90._0_4_ >> 0x10) - fVar238) * fVar206 + fVar238) - fVar430) * fVar166;
  auVar407._8_4_ =
       ((((float)(auVar178._8_4_ >> 0x10) - fVar253) * fVar206 + fVar253) - fVar432) * fVar242;
  auVar407._12_4_ =
       ((((float)(auVar179._12_4_ >> 0x10) - (float)(auVar146._12_4_ >> 0x10)) * fVar206 +
        (float)(auVar146._12_4_ >> 0x10)) - fVar440) * fVar401;
  auVar226._8_4_ = auVar261._8_4_;
  auVar226._0_8_ = auVar261._0_8_;
  auVar226._12_4_ = auVar261._12_4_;
  auVar256 = minps(auVar226,auVar304);
  auVar148._8_4_ = auVar348._8_4_;
  auVar148._0_8_ = auVar348._0_8_;
  auVar148._12_4_ = auVar348._12_4_;
  auVar126 = minps(auVar148,auVar369);
  auVar256 = maxps(auVar256,auVar126);
  auVar149._8_4_ = auVar388._8_4_;
  auVar149._0_8_ = auVar388._0_8_;
  auVar149._12_4_ = auVar388._12_4_;
  auVar126 = minps(auVar149,auVar407);
  auVar181._4_4_ = uVar7;
  auVar181._0_4_ = uVar7;
  auVar181._8_4_ = uVar7;
  auVar181._12_4_ = uVar7;
  auVar126 = maxps(auVar126,auVar181);
  auVar126 = maxps(auVar256,auVar126);
  fVar416 = auVar126._0_4_ * 0.99999964;
  fVar122 = auVar126._4_4_ * 0.99999964;
  fVar166 = auVar126._8_4_ * 0.99999964;
  fVar167 = auVar126._12_4_ * 0.99999964;
  auVar126 = maxps(auVar261,auVar304);
  auVar256 = maxps(auVar348,auVar369);
  auVar126 = minps(auVar126,auVar256);
  auVar256 = maxps(auVar388,auVar407);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar150._4_4_ = uVar7;
  auVar150._0_4_ = uVar7;
  auVar150._8_4_ = uVar7;
  auVar150._12_4_ = uVar7;
  auVar256 = minps(auVar256,auVar150);
  auVar126 = minps(auVar126,auVar256);
  auVar182._0_4_ = -(uint)(PVar18 != (Primitive)0x0 && fVar416 <= auVar126._0_4_ * 1.0000004);
  auVar182._4_4_ = -(uint)(1 < (byte)PVar18 && fVar122 <= auVar126._4_4_ * 1.0000004);
  auVar182._8_4_ = -(uint)(2 < (byte)PVar18 && fVar166 <= auVar126._8_4_ * 1.0000004);
  auVar182._12_4_ = -(uint)(3 < (byte)PVar18 && fVar167 <= auVar126._12_4_ * 1.0000004);
  uVar117 = movmskps((int)(uVar107 * 0x23),auVar182);
  local_398 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar35 = (int)mm_lookupmask_ps._240_4_ < 0;
  bVar36 = (int)mm_lookupmask_ps._244_4_ < 0;
  bVar37 = (int)mm_lookupmask_ps._248_4_ < 0;
  local_4f8 = ray;
  local_390 = prim;
LAB_003b3ae2:
  if (uVar117 == 0) {
LAB_003b60c5:
    return uVar117 != 0;
  }
  lVar113 = 0;
  if (uVar117 != 0) {
    for (; (uVar117 >> lVar113 & 1) == 0; lVar113 = lVar113 + 1) {
    }
  }
  uVar118 = *(uint *)(local_390 + 2);
  uVar119 = *(uint *)(local_390 + lVar113 * 4 + 6);
  pGVar26 = (context->scene->geometries).items[uVar118].ptr;
  fVar168 = pGVar26->fnumTimeSegments;
  fVar201 = (pGVar26->time_range).lower;
  fVar203 = ((*(float *)(local_4f8 + k * 4 + 0x70) - fVar201) /
            ((pGVar26->time_range).upper - fVar201)) * fVar168;
  fVar201 = floorf(fVar203);
  fVar168 = fVar168 + -1.0;
  if (fVar168 <= fVar201) {
    fVar201 = fVar168;
  }
  fVar168 = 0.0;
  if (0.0 <= fVar201) {
    fVar168 = fVar201;
  }
  uVar109 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                            (ulong)uVar119 *
                            pGVar26[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar114 = (long)(int)fVar168 * 0x38;
  lVar28 = *(long *)(_Var27 + 0x10 + lVar114);
  pfVar1 = (float *)(*(long *)(_Var27 + lVar114) + lVar28 * uVar109);
  fVar201 = *pfVar1;
  fVar207 = pfVar1[1];
  fVar238 = pfVar1[2];
  fVar240 = pfVar1[3];
  lVar113 = uVar109 + 1;
  pfVar1 = (float *)(*(long *)(_Var27 + lVar114) + lVar28 * lVar113);
  fVar242 = *pfVar1;
  fVar243 = pfVar1[1];
  fVar251 = pfVar1[2];
  fVar252 = pfVar1[3];
  p_Var110 = pGVar26[4].occlusionFilterN;
  lVar28 = *(long *)&pGVar26[4].fnumTimeSegments;
  lVar29 = *(long *)(lVar28 + 0x10 + lVar114);
  pfVar1 = (float *)(*(long *)(lVar28 + lVar114) + lVar29 * uVar109);
  fVar253 = *pfVar1;
  fVar287 = pfVar1[1];
  fVar401 = pfVar1[2];
  pfVar2 = (float *)(*(long *)(lVar28 + lVar114) + lVar29 * lVar113);
  fVar206 = *pfVar2;
  fVar292 = pfVar2[1];
  fVar312 = pfVar2[2];
  _Var30 = pGVar26[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar29 = *(long *)(_Var30 + 0x10 + lVar114);
  pfVar3 = (float *)(*(long *)(_Var30 + lVar114) + lVar29 * uVar109);
  pfVar4 = (float *)(*(long *)(_Var30 + lVar114) + lVar29 * lVar113);
  pfVar6 = (float *)(*(long *)(p_Var110 + lVar114) + *(long *)(p_Var110 + lVar114 + 0x10) * uVar109)
  ;
  fVar203 = fVar203 - fVar168;
  fVar168 = *pfVar6 * 0.33333334 + fVar201;
  fVar315 = pfVar6[1] * 0.33333334 + fVar207;
  fVar327 = pfVar6[2] * 0.33333334 + fVar238;
  fVar412 = pfVar6[3] * 0.33333334 + fVar240;
  pfVar6 = (float *)(*(long *)(p_Var110 + lVar114) + *(long *)(p_Var110 + lVar114 + 0x10) * lVar113)
  ;
  fVar413 = fVar242 - *pfVar6 * 0.33333334;
  fVar432 = fVar243 - pfVar6[1] * 0.33333334;
  fVar442 = fVar251 - pfVar6[2] * 0.33333334;
  fVar451 = fVar252 - pfVar6[3] * 0.33333334;
  fVar254 = *pfVar3 * 0.33333334 + fVar253;
  fVar420 = pfVar3[1] * 0.33333334 + fVar287;
  fVar422 = pfVar3[2] * 0.33333334 + fVar401;
  fVar316 = fVar206 - *pfVar4 * 0.33333334;
  fVar328 = fVar292 - pfVar4[1] * 0.33333334;
  fVar334 = fVar312 - pfVar4[2] * 0.33333334;
  fVar393 = fVar413 * 0.0;
  fVar255 = fVar432 * 0.0;
  fVar341 = fVar442 * 0.0;
  fVar360 = fVar451 * 0.0;
  fVar333 = fVar242 * 0.0 + fVar393;
  fVar356 = fVar243 * 0.0 + fVar255;
  fVar402 = fVar251 * 0.0 + fVar341;
  fVar417 = fVar252 * 0.0 + fVar360;
  fVar365 = fVar168 * 0.0;
  fVar375 = fVar315 * 0.0;
  fVar378 = fVar327 * 0.0;
  fVar382 = fVar412 * 0.0;
  fVar430 = fVar365 + fVar333 + fVar201;
  fVar440 = fVar375 + fVar356 + fVar207;
  fVar449 = fVar378 + fVar402 + fVar238;
  fVar273 = fVar382 + fVar417 + fVar240;
  fVar333 = (fVar168 * 3.0 + fVar333) - fVar201 * 3.0;
  fVar356 = (fVar315 * 3.0 + fVar356) - fVar207 * 3.0;
  fVar402 = (fVar327 * 3.0 + fVar402) - fVar238 * 3.0;
  fVar417 = (fVar412 * 3.0 + fVar417) - fVar240 * 3.0;
  fVar366 = fVar316 * 0.0;
  fVar376 = fVar328 * 0.0;
  fVar379 = fVar334 * 0.0;
  fVar168 = fVar206 * 0.0 + fVar366;
  fVar315 = fVar292 * 0.0 + fVar376;
  fVar327 = fVar312 * 0.0 + fVar379;
  fVar385 = fVar254 * 0.0;
  fVar394 = fVar420 * 0.0;
  fVar397 = fVar422 * 0.0;
  fVar317 = fVar385 + fVar168 + fVar253;
  fVar329 = fVar394 + fVar315 + fVar287;
  fVar335 = fVar397 + fVar327 + fVar401;
  fVar339 = (pfVar3[3] * 0.33333334 + pfVar1[3]) * 0.0 +
            pfVar2[3] * 0.0 + (pfVar2[3] - pfVar4[3] * 0.33333334) * 0.0 + pfVar1[3];
  fVar453 = (fVar254 * 3.0 + fVar168) - fVar253 * 3.0;
  fVar293 = (fVar420 * 3.0 + fVar315) - fVar287 * 3.0;
  fVar295 = (fVar422 * 3.0 + fVar327) - fVar401 * 3.0;
  fVar254 = fVar393 + fVar242 + fVar365 + fVar201 * 0.0;
  fVar255 = fVar255 + fVar243 + fVar375 + fVar207 * 0.0;
  fVar420 = fVar341 + fVar251 + fVar378 + fVar238 * 0.0;
  fVar422 = fVar360 + fVar252 + fVar382 + fVar240 * 0.0;
  fVar315 = ((fVar242 * 3.0 - fVar413 * 3.0) + fVar365) - fVar201 * 0.0;
  fVar327 = ((fVar243 * 3.0 - fVar432 * 3.0) + fVar375) - fVar207 * 0.0;
  fVar393 = ((fVar251 * 3.0 - fVar442 * 3.0) + fVar378) - fVar238 * 0.0;
  fVar412 = ((fVar252 * 3.0 - fVar451 * 3.0) + fVar382) - fVar240 * 0.0;
  fVar238 = fVar366 + fVar206 + fVar385 + fVar253 * 0.0;
  fVar240 = fVar376 + fVar292 + fVar394 + fVar287 * 0.0;
  fVar242 = fVar379 + fVar312 + fVar397 + fVar401 * 0.0;
  fVar168 = ((fVar206 * 3.0 - fVar316 * 3.0) + fVar385) - fVar253 * 0.0;
  fVar201 = ((fVar292 * 3.0 - fVar328 * 3.0) + fVar394) - fVar287 * 0.0;
  fVar207 = ((fVar312 * 3.0 - fVar334 * 3.0) + fVar397) - fVar401 * 0.0;
  fVar316 = fVar356 * fVar317 - fVar329 * fVar333;
  fVar328 = fVar402 * fVar329 - fVar335 * fVar356;
  fVar317 = fVar333 * fVar335 - fVar317 * fVar402;
  fVar341 = fVar356 * fVar453 - fVar293 * fVar333;
  fVar413 = fVar402 * fVar293 - fVar295 * fVar356;
  fVar453 = fVar333 * fVar295 - fVar453 * fVar402;
  fVar432 = fVar327 * fVar238 - fVar240 * fVar315;
  fVar442 = fVar393 * fVar240 - fVar242 * fVar327;
  fVar451 = fVar315 * fVar242 - fVar238 * fVar393;
  fVar206 = fVar327 * fVar168 - fVar201 * fVar315;
  fVar292 = fVar393 * fVar201 - fVar207 * fVar327;
  fVar312 = fVar315 * fVar207 - fVar168 * fVar393;
  fVar401 = fVar317 * fVar317 + fVar328 * fVar328 + fVar316 * fVar316;
  auVar126 = ZEXT416((uint)fVar401);
  auVar256 = rsqrtss(ZEXT416((uint)fVar401),auVar126);
  fVar168 = auVar256._0_4_;
  fVar367 = fVar168 * 1.5 - fVar168 * fVar168 * fVar401 * 0.5 * fVar168;
  fVar295 = fVar316 * fVar341 + fVar317 * fVar453 + fVar328 * fVar413;
  auVar126 = rcpss(auVar126,auVar126);
  fVar360 = (2.0 - fVar401 * auVar126._0_4_) * auVar126._0_4_;
  fVar293 = fVar451 * fVar451 + fVar442 * fVar442 + fVar432 * fVar432;
  auVar256 = ZEXT416((uint)fVar293);
  auVar126 = rsqrtss(ZEXT416((uint)fVar293),auVar256);
  fVar168 = auVar126._0_4_;
  fVar329 = fVar168 * 1.5 - fVar168 * fVar168 * fVar293 * 0.5 * fVar168;
  fVar334 = fVar432 * fVar206 + fVar451 * fVar312 + fVar442 * fVar292;
  lVar29 = *(long *)(_Var27 + 0x38 + lVar114);
  lVar31 = *(long *)(_Var27 + 0x48 + lVar114);
  pfVar1 = (float *)(lVar29 + lVar31 * uVar109);
  fVar168 = *pfVar1;
  fVar201 = pfVar1[1];
  fVar207 = pfVar1[2];
  fVar238 = pfVar1[3];
  pfVar1 = (float *)(lVar29 + lVar31 * lVar113);
  fVar240 = *pfVar1;
  fVar242 = pfVar1[1];
  fVar243 = pfVar1[2];
  fVar251 = pfVar1[3];
  lVar29 = *(long *)(lVar28 + 0x38 + lVar114);
  lVar28 = *(long *)(lVar28 + 0x48 + lVar114);
  pfVar3 = (float *)(lVar29 + lVar28 * lVar113);
  fVar252 = *pfVar3;
  fVar253 = pfVar3[1];
  fVar287 = pfVar3[2];
  lVar31 = *(long *)(_Var30 + 0x38 + lVar114);
  lVar32 = *(long *)(_Var30 + 0x48 + lVar114);
  uVar108 = uVar109 * lVar32;
  auVar126 = rcpss(auVar256,auVar256);
  pfVar1 = (float *)(lVar31 + lVar32 * lVar113);
  fVar335 = (2.0 - fVar293 * auVar126._0_4_) * auVar126._0_4_;
  fVar423 = fVar273 * fVar328 * fVar367;
  fVar431 = fVar273 * fVar317 * fVar367;
  fVar433 = fVar273 * fVar316 * fVar367;
  fVar394 = fVar430 - fVar423;
  fVar330 = fVar440 - fVar431;
  fVar336 = fVar449 - fVar433;
  fVar403 = fVar273 * fVar360 * (fVar401 * fVar413 - fVar295 * fVar328) * fVar367 +
            fVar417 * fVar328 * fVar367;
  fVar414 = fVar273 * fVar360 * (fVar401 * fVar453 - fVar295 * fVar317) * fVar367 +
            fVar417 * fVar317 * fVar367;
  fVar418 = fVar273 * fVar360 * (fVar401 * fVar341 - fVar295 * fVar316) * fVar367 +
            fVar417 * fVar316 * fVar367;
  fVar423 = fVar423 + fVar430;
  fVar431 = fVar431 + fVar440;
  fVar433 = fVar433 + fVar449;
  fVar341 = fVar422 * fVar442 * fVar329;
  fVar360 = fVar422 * fVar451 * fVar329;
  fVar413 = fVar422 * fVar432 * fVar329;
  pfVar2 = (float *)(*(long *)(p_Var110 + lVar114 + 0x38) +
                    *(long *)(p_Var110 + lVar114 + 0x48) * lVar113);
  fVar342 = fVar254 - fVar341;
  fVar357 = fVar255 - fVar360;
  fVar361 = fVar420 - fVar413;
  fVar453 = fVar422 * fVar335 * (fVar293 * fVar292 - fVar334 * fVar442) * fVar329 +
            fVar412 * fVar442 * fVar329;
  fVar316 = fVar422 * fVar335 * (fVar293 * fVar312 - fVar334 * fVar451) * fVar329 +
            fVar412 * fVar451 * fVar329;
  fVar329 = fVar422 * fVar335 * (fVar293 * fVar206 - fVar334 * fVar432) * fVar329 +
            fVar412 * fVar432 * fVar329;
  fVar341 = fVar341 + fVar254;
  fVar360 = fVar360 + fVar255;
  fVar413 = fVar413 + fVar420;
  fVar420 = fVar240 - *pfVar2 * 0.33333334;
  fVar430 = fVar242 - pfVar2[1] * 0.33333334;
  fVar440 = fVar243 - pfVar2[2] * 0.33333334;
  fVar449 = fVar251 - pfVar2[3] * 0.33333334;
  fVar375 = fVar252 - *pfVar1 * 0.33333334;
  fVar378 = fVar253 - pfVar1[1] * 0.33333334;
  fVar382 = fVar287 - pfVar1[2] * 0.33333334;
  fVar312 = fVar420 * 0.0;
  fVar412 = fVar430 * 0.0;
  fVar254 = fVar440 * 0.0;
  fVar255 = fVar449 * 0.0;
  fVar366 = fVar240 * 0.0 + fVar312;
  fVar331 = fVar242 * 0.0 + fVar412;
  fVar337 = fVar243 * 0.0 + fVar254;
  fVar340 = fVar251 * 0.0 + fVar255;
  pfVar2 = (float *)(*(long *)(p_Var110 + lVar114 + 0x38) +
                    *(long *)(p_Var110 + lVar114 + 0x48) * uVar109);
  fVar401 = *pfVar2 * 0.33333334 + fVar168;
  fVar206 = pfVar2[1] * 0.33333334 + fVar201;
  fVar292 = pfVar2[2] * 0.33333334 + fVar207;
  fVar451 = pfVar2[3] * 0.33333334 + fVar238;
  fVar293 = fVar401 * 0.0;
  fVar317 = fVar206 * 0.0;
  fVar334 = fVar292 * 0.0;
  fVar365 = fVar451 * 0.0;
  fVar422 = (fVar401 * 3.0 + fVar366) - fVar168 * 3.0;
  fVar432 = (fVar206 * 3.0 + fVar331) - fVar201 * 3.0;
  fVar442 = (fVar292 * 3.0 + fVar337) - fVar207 * 3.0;
  fVar451 = (fVar451 * 3.0 + fVar340) - fVar238 * 3.0;
  fVar343 = fVar375 * 0.0;
  fVar358 = fVar378 * 0.0;
  fVar362 = fVar382 * 0.0;
  fVar397 = fVar252 * 0.0 + fVar343;
  fVar332 = fVar253 * 0.0 + fVar358;
  fVar338 = fVar287 * 0.0 + fVar362;
  pfVar2 = (float *)(lVar31 + uVar108);
  pfVar4 = (float *)(lVar29 + lVar28 * uVar109);
  fVar401 = *pfVar4;
  fVar206 = pfVar4[1];
  fVar292 = pfVar4[2];
  fVar295 = *pfVar2 * 0.33333334 + fVar401;
  fVar328 = pfVar2[1] * 0.33333334 + fVar206;
  fVar335 = pfVar2[2] * 0.33333334 + fVar292;
  fVar386 = fVar295 * 0.0;
  fVar395 = fVar328 * 0.0;
  fVar398 = fVar335 * 0.0;
  fVar376 = (fVar295 * 3.0 + fVar397) - fVar401 * 3.0;
  fVar379 = (fVar328 * 3.0 + fVar332) - fVar206 * 3.0;
  fVar385 = (fVar335 * 3.0 + fVar338) - fVar292 * 3.0;
  fVar295 = fVar293 + fVar366 + fVar168;
  fVar328 = fVar317 + fVar331 + fVar201;
  fVar335 = fVar334 + fVar337 + fVar207;
  fVar366 = fVar365 + fVar340 + fVar238;
  fVar312 = fVar312 + fVar240 + fVar293 + fVar168 * 0.0;
  fVar412 = fVar412 + fVar242 + fVar317 + fVar201 * 0.0;
  fVar254 = fVar254 + fVar243 + fVar334 + fVar207 * 0.0;
  fVar255 = fVar255 + fVar251 + fVar365 + fVar238 * 0.0;
  fVar168 = ((fVar240 * 3.0 - fVar420 * 3.0) + fVar293) - fVar168 * 0.0;
  fVar201 = ((fVar242 * 3.0 - fVar430 * 3.0) + fVar317) - fVar201 * 0.0;
  fVar207 = ((fVar243 * 3.0 - fVar440 * 3.0) + fVar334) - fVar207 * 0.0;
  fVar238 = ((fVar251 * 3.0 - fVar449 * 3.0) + fVar365) - fVar238 * 0.0;
  fVar440 = fVar386 + fVar397 + fVar401;
  fVar293 = fVar395 + fVar332 + fVar206;
  fVar334 = fVar398 + fVar338 + fVar292;
  fVar397 = (pfVar2[3] * 0.33333334 + pfVar4[3]) * 0.0 +
            pfVar3[3] * 0.0 + (pfVar3[3] - pfVar1[3] * 0.33333334) * 0.0 + pfVar4[3];
  fVar251 = fVar343 + fVar252 + fVar386 + fVar401 * 0.0;
  fVar420 = fVar358 + fVar253 + fVar395 + fVar206 * 0.0;
  fVar430 = fVar362 + fVar287 + fVar398 + fVar292 * 0.0;
  fVar240 = ((fVar252 * 3.0 - fVar375 * 3.0) + fVar386) - fVar401 * 0.0;
  fVar242 = ((fVar253 * 3.0 - fVar378 * 3.0) + fVar395) - fVar206 * 0.0;
  fVar243 = ((fVar287 * 3.0 - fVar382 * 3.0) + fVar398) - fVar292 * 0.0;
  fVar449 = fVar432 * fVar440 - fVar293 * fVar422;
  fVar317 = fVar442 * fVar293 - fVar334 * fVar432;
  fVar365 = fVar422 * fVar334 - fVar440 * fVar442;
  fVar206 = fVar432 * fVar376 - fVar379 * fVar422;
  fVar252 = fVar442 * fVar379 - fVar385 * fVar432;
  fVar287 = fVar422 * fVar385 - fVar376 * fVar442;
  fVar292 = fVar201 * fVar251 - fVar420 * fVar168;
  fVar293 = fVar207 * fVar420 - fVar430 * fVar201;
  fVar334 = fVar168 * fVar430 - fVar251 * fVar207;
  fVar251 = fVar201 * fVar240 - fVar242 * fVar168;
  fVar253 = fVar207 * fVar242 - fVar243 * fVar201;
  fVar401 = fVar168 * fVar243 - fVar240 * fVar207;
  fVar240 = fVar365 * fVar365 + fVar317 * fVar317 + fVar449 * fVar449;
  auVar126 = ZEXT416((uint)fVar240);
  auVar256 = rsqrtss(ZEXT416((uint)fVar240),auVar126);
  fVar242 = auVar256._0_4_;
  fVar376 = fVar242 * 1.5 - fVar242 * fVar242 * fVar240 * 0.5 * fVar242;
  fVar243 = fVar449 * fVar206 + fVar365 * fVar287 + fVar317 * fVar252;
  auVar126 = rcpss(auVar126,auVar126);
  fVar242 = (2.0 - fVar240 * auVar126._0_4_) * auVar126._0_4_;
  fVar375 = fVar334 * fVar334 + fVar293 * fVar293 + fVar292 * fVar292;
  auVar126 = ZEXT416((uint)fVar375);
  auVar256 = rsqrtss(ZEXT416((uint)fVar375),auVar126);
  fVar420 = auVar256._0_4_;
  fVar378 = fVar420 * 1.5 - fVar420 * fVar420 * fVar375 * 0.5 * fVar420;
  fVar379 = fVar292 * fVar251 + fVar334 * fVar401 + fVar293 * fVar253;
  auVar126 = rcpss(auVar126,auVar126);
  fVar382 = (2.0 - fVar375 * auVar126._0_4_) * auVar126._0_4_;
  fVar420 = fVar366 * fVar317 * fVar376;
  fVar430 = fVar366 * fVar365 * fVar376;
  fVar440 = fVar366 * fVar449 * fVar376;
  fVar252 = fVar366 * fVar242 * (fVar240 * fVar252 - fVar243 * fVar317) * fVar376 +
            fVar451 * fVar317 * fVar376;
  fVar287 = fVar366 * fVar242 * (fVar240 * fVar287 - fVar243 * fVar365) * fVar376 +
            fVar451 * fVar365 * fVar376;
  fVar206 = fVar366 * fVar242 * (fVar240 * fVar206 - fVar243 * fVar449) * fVar376 +
            fVar451 * fVar449 * fVar376;
  fVar449 = fVar295 - fVar420;
  fVar317 = fVar328 - fVar430;
  fVar365 = fVar335 - fVar440;
  fVar420 = fVar420 + fVar295;
  fVar430 = fVar430 + fVar328;
  fVar440 = fVar440 + fVar335;
  fVar240 = fVar255 * fVar293 * fVar378;
  fVar242 = fVar255 * fVar334 * fVar378;
  fVar243 = fVar255 * fVar292 * fVar378;
  fVar293 = fVar255 * fVar382 * (fVar375 * fVar253 - fVar379 * fVar293) * fVar378 +
            fVar238 * fVar293 * fVar378;
  fVar328 = fVar255 * fVar382 * (fVar375 * fVar401 - fVar379 * fVar334) * fVar378 +
            fVar238 * fVar334 * fVar378;
  fVar334 = fVar255 * fVar382 * (fVar375 * fVar251 - fVar379 * fVar292) * fVar378 +
            fVar238 * fVar292 * fVar378;
  fVar238 = fVar312 - fVar240;
  fVar251 = fVar412 - fVar242;
  fVar253 = fVar254 - fVar243;
  fVar240 = fVar240 + fVar312;
  fVar242 = fVar242 + fVar412;
  fVar243 = fVar243 + fVar254;
  fVar295 = 1.0 - fVar203;
  fVar335 = fVar394 * fVar295 + fVar449 * fVar203;
  fVar375 = fVar330 * fVar295 + fVar317 * fVar203;
  fVar378 = fVar336 * fVar295 + fVar365 * fVar203;
  fVar385 = ((fVar333 - fVar403) * 0.33333334 + fVar394) * fVar295 +
            ((fVar422 - fVar252) * 0.33333334 + fVar449) * fVar203;
  fVar331 = ((fVar356 - fVar414) * 0.33333334 + fVar330) * fVar295 +
            ((fVar432 - fVar287) * 0.33333334 + fVar317) * fVar203;
  fVar337 = ((fVar402 - fVar418) * 0.33333334 + fVar336) * fVar295 +
            ((fVar442 - fVar206) * 0.33333334 + fVar365) * fVar203;
  fVar412 = (fVar342 - (fVar315 - fVar453) * 0.33333334) * fVar295 +
            (fVar238 - (fVar168 - fVar293) * 0.33333334) * fVar203;
  fVar254 = (fVar357 - (fVar327 - fVar316) * 0.33333334) * fVar295 +
            (fVar251 - (fVar201 - fVar328) * 0.33333334) * fVar203;
  fVar255 = (fVar361 - (fVar393 - fVar329) * 0.33333334) * fVar295 +
            (fVar253 - (fVar207 - fVar334) * 0.33333334) * fVar203;
  fVar340 = fVar342 * fVar295 + fVar238 * fVar203;
  fVar357 = fVar357 * fVar295 + fVar251 * fVar203;
  fVar362 = fVar361 * fVar295 + fVar253 * fVar203;
  fVar253 = fVar423 * fVar295 + fVar420 * fVar203;
  fVar401 = fVar431 * fVar295 + fVar430 * fVar203;
  fVar292 = fVar433 * fVar295 + fVar440 * fVar203;
  fVar420 = ((fVar403 + fVar333) * 0.33333334 + fVar423) * fVar295 +
            ((fVar252 + fVar422) * 0.33333334 + fVar420) * fVar203;
  fVar422 = ((fVar414 + fVar356) * 0.33333334 + fVar431) * fVar295 +
            ((fVar287 + fVar432) * 0.33333334 + fVar430) * fVar203;
  fVar430 = ((fVar418 + fVar402) * 0.33333334 + fVar433) * fVar295 +
            ((fVar206 + fVar442) * 0.33333334 + fVar440) * fVar203;
  fVar287 = (fVar341 - (fVar453 + fVar315) * 0.33333334) * fVar295 +
            (fVar240 - (fVar293 + fVar168) * 0.33333334) * fVar203;
  fVar206 = (fVar360 - (fVar316 + fVar327) * 0.33333334) * fVar295 +
            (fVar242 - (fVar328 + fVar201) * 0.33333334) * fVar203;
  fVar312 = (fVar413 - (fVar329 + fVar393) * 0.33333334) * fVar295 +
            (fVar243 - (fVar334 + fVar207) * 0.33333334) * fVar203;
  fVar432 = fVar295 * fVar341 + fVar203 * fVar240;
  fVar440 = fVar295 * fVar360 + fVar203 * fVar242;
  fVar413 = fVar295 * fVar413 + fVar203 * fVar243;
  fVar168 = *(float *)(local_4f8 + k * 4);
  fVar201 = *(float *)(local_4f8 + k * 4 + 0x10);
  fVar207 = *(float *)(local_4f8 + k * 4 + 0x20);
  fVar315 = fVar335 - fVar168;
  fVar327 = fVar375 - fVar201;
  fVar393 = fVar378 - fVar207;
  fVar238 = pre->ray_space[k].vx.field_0.m128[0];
  fVar240 = pre->ray_space[k].vx.field_0.m128[1];
  fVar242 = pre->ray_space[k].vy.field_0.m128[0];
  fVar243 = pre->ray_space[k].vy.field_0.m128[1];
  fVar251 = pre->ray_space[k].vz.field_0.m128[0];
  fVar252 = pre->ray_space[k].vz.field_0.m128[1];
  fVar442 = fVar315 * fVar238 + fVar327 * fVar242 + fVar393 * fVar251;
  fVar449 = fVar315 * fVar240 + fVar327 * fVar243 + fVar393 * fVar252;
  auVar151._4_4_ = fVar449;
  auVar151._0_4_ = fVar442;
  fVar333 = fVar385 - fVar168;
  fVar341 = fVar331 - fVar201;
  fVar356 = fVar337 - fVar207;
  fVar360 = fVar333 * fVar238 + fVar341 * fVar242 + fVar356 * fVar251;
  fVar402 = fVar333 * fVar240 + fVar341 * fVar243 + fVar356 * fVar252;
  auVar408._4_4_ = fVar402;
  auVar408._0_4_ = fVar360;
  fVar395 = fVar412 - fVar168;
  fVar403 = fVar254 - fVar201;
  fVar418 = fVar255 - fVar207;
  fVar398 = fVar395 * fVar238 + fVar403 * fVar242 + fVar418 * fVar251;
  fVar414 = fVar395 * fVar240 + fVar403 * fVar243 + fVar418 * fVar252;
  auVar183._4_4_ = fVar414;
  auVar183._0_4_ = fVar398;
  fVar342 = fVar340 - fVar168;
  fVar358 = fVar357 - fVar201;
  fVar386 = fVar362 - fVar207;
  fVar343 = fVar342 * fVar238 + fVar358 * fVar242 + fVar386 * fVar251;
  fVar361 = fVar342 * fVar240 + fVar358 * fVar243 + fVar386 * fVar252;
  auVar318._4_4_ = fVar361;
  auVar318._0_4_ = fVar343;
  fVar453 = fVar253 - fVar168;
  fVar316 = fVar401 - fVar201;
  fVar328 = fVar292 - fVar207;
  fVar293 = fVar453 * fVar238 + fVar316 * fVar242 + fVar328 * fVar251;
  fVar317 = fVar453 * fVar240 + fVar316 * fVar243 + fVar328 * fVar252;
  fVar329 = fVar420 - fVar168;
  fVar365 = fVar422 - fVar201;
  fVar382 = fVar430 - fVar207;
  fVar334 = fVar329 * fVar238 + fVar365 * fVar242 + fVar382 * fVar251;
  fVar379 = fVar329 * fVar240 + fVar365 * fVar243 + fVar382 * fVar252;
  auVar408._12_4_ = fVar379;
  auVar408._8_4_ = fVar334;
  fVar394 = fVar287 - fVar168;
  fVar332 = fVar206 - fVar201;
  fVar338 = fVar312 - fVar207;
  fVar330 = fVar394 * fVar238 + fVar332 * fVar242 + fVar338 * fVar251;
  fVar336 = fVar394 * fVar240 + fVar332 * fVar243 + fVar338 * fVar252;
  fVar168 = fVar432 - fVar168;
  fVar201 = fVar440 - fVar201;
  fVar207 = fVar413 - fVar207;
  fVar242 = fVar168 * fVar238 + fVar201 * fVar242 + fVar207 * fVar251;
  fVar240 = fVar168 * fVar240 + fVar201 * fVar243 + fVar207 * fVar252;
  auVar318._12_4_ = fVar240;
  auVar318._8_4_ = fVar242;
  auVar151._8_4_ = fVar293;
  auVar151._12_4_ = fVar317;
  auVar126 = minps(auVar151,auVar408);
  auVar183._8_4_ = fVar330;
  auVar183._12_4_ = fVar336;
  auVar256 = minps(auVar183,auVar318);
  auVar126 = minps(auVar126,auVar256);
  auVar184._4_4_ = fVar449;
  auVar184._0_4_ = fVar442;
  auVar184._8_4_ = fVar293;
  auVar184._12_4_ = fVar317;
  auVar256 = maxps(auVar184,auVar408);
  auVar227._4_4_ = fVar414;
  auVar227._0_4_ = fVar398;
  auVar227._8_4_ = fVar330;
  auVar227._12_4_ = fVar336;
  auVar125 = maxps(auVar227,auVar318);
  auVar185 = maxps(auVar256,auVar125);
  auVar38._4_8_ = auVar125._8_8_;
  auVar38._0_4_ = auVar126._4_4_;
  auVar228._0_8_ = auVar38._0_8_ << 0x20;
  auVar228._8_4_ = auVar126._8_4_;
  auVar228._12_4_ = auVar126._12_4_;
  auVar229._8_8_ = auVar126._8_8_;
  auVar229._0_8_ = auVar228._8_8_;
  auVar256 = minps(auVar126,auVar229);
  auVar39._4_8_ = auVar126._8_8_;
  auVar39._0_4_ = auVar185._4_4_;
  auVar230._0_8_ = auVar39._0_8_ << 0x20;
  auVar230._8_4_ = auVar185._8_4_;
  auVar230._12_4_ = auVar185._12_4_;
  auVar231._8_8_ = auVar185._8_8_;
  auVar231._0_8_ = auVar230._8_8_;
  auVar126 = maxps(auVar185,auVar231);
  auVar152._0_8_ = auVar256._0_8_ & 0x7fffffff7fffffff;
  auVar152._8_4_ = auVar256._8_4_ & 0x7fffffff;
  auVar152._12_4_ = auVar256._12_4_ & 0x7fffffff;
  auVar186._0_8_ = auVar126._0_8_ & 0x7fffffff7fffffff;
  auVar186._8_4_ = auVar126._8_4_ & 0x7fffffff;
  auVar186._12_4_ = auVar126._12_4_ & 0x7fffffff;
  auVar126 = maxps(auVar152,auVar186);
  fVar238 = auVar126._4_4_;
  if (auVar126._4_4_ <= auVar126._0_4_) {
    fVar238 = auVar126._0_4_;
  }
  fVar238 = fVar238 * 9.536743e-07;
  local_3a8._4_4_ = fVar317;
  local_3a8._0_4_ = fVar293;
  bVar112 = 0;
  uVar120 = 0;
  fVar243 = *(float *)(local_4f8 + k * 4 + 0x30);
  local_538._0_4_ = 0.0;
  local_538._4_4_ = 1.0;
  fStack_530 = 0.0;
  fStack_52c = 0.0;
  local_518.lower = 0.0;
  local_518.upper = 1.0;
  pRVar115 = local_4f8;
LAB_003b48dc:
  do {
    fVar251 = 1.0 - (float)local_538._0_4_;
    fVar252 = 1.0 - (float)local_538._0_4_;
    fVar423 = 1.0 - (float)local_538._4_4_;
    fVar431 = 1.0 - (float)local_538._4_4_;
    fVar368 = fVar442 * fVar251 + fVar293 * (float)local_538._0_4_;
    fVar377 = fVar449 * fVar252 + fVar317 * (float)local_538._0_4_;
    fVar380 = fVar442 * fVar423 + fVar293 * (float)local_538._4_4_;
    fVar383 = fVar449 * fVar431 + fVar317 * (float)local_538._4_4_;
    fVar344 = fVar360 * fVar251 + fVar334 * (float)local_538._0_4_;
    fVar359 = fVar402 * fVar252 + fVar379 * (float)local_538._0_4_;
    fVar363 = fVar360 * fVar423 + fVar334 * (float)local_538._4_4_;
    fVar364 = fVar402 * fVar431 + fVar379 * (float)local_538._4_4_;
    fVar443 = fVar398 * fVar251 + fVar330 * (float)local_538._0_4_;
    fVar450 = fVar414 * fVar252 + fVar336 * (float)local_538._0_4_;
    fVar452 = fVar398 * fVar423 + fVar330 * (float)local_538._4_4_;
    fVar454 = fVar414 * fVar431 + fVar336 * (float)local_538._4_4_;
    fVar387 = fVar251 * fVar343 + (float)local_538._0_4_ * fVar242;
    fVar396 = fVar252 * fVar361 + (float)local_538._0_4_ * fVar240;
    fVar399 = fVar423 * fVar343 + (float)local_538._4_4_ * fVar242;
    fVar400 = fVar431 * fVar361 + (float)local_538._4_4_ * fVar240;
    fVar424 = (local_518.upper - local_518.lower) * 0.11111111;
    fVar434 = (local_518.upper - local_518.lower) * 0.0 + local_518.lower;
    fVar438 = (local_518.upper - local_518.lower) * 0.33333334 + local_518.lower;
    fVar439 = (local_518.upper - local_518.lower) * 0.6666667 + local_518.lower;
    fVar441 = (local_518.upper - local_518.lower) * 1.0 + local_518.lower;
    fVar252 = 1.0 - fVar434;
    fVar423 = 1.0 - fVar438;
    fVar433 = 1.0 - fVar439;
    fVar241 = 1.0 - fVar441;
    fVar274 = fVar344 * fVar252 + fVar443 * fVar434;
    fVar286 = fVar344 * fVar423 + fVar443 * fVar438;
    fVar288 = fVar344 * fVar433 + fVar443 * fVar439;
    fVar289 = fVar344 * fVar241 + fVar443 * fVar441;
    fVar290 = fVar359 * fVar252 + fVar450 * fVar434;
    fVar294 = fVar359 * fVar423 + fVar450 * fVar438;
    fVar296 = fVar359 * fVar433 + fVar450 * fVar439;
    fVar297 = fVar359 * fVar241 + fVar450 * fVar441;
    fVar251 = (fVar368 * fVar252 + fVar344 * fVar434) * fVar252 + fVar434 * fVar274;
    fVar431 = (fVar368 * fVar423 + fVar344 * fVar438) * fVar423 + fVar438 * fVar286;
    fVar272 = (fVar368 * fVar433 + fVar344 * fVar439) * fVar433 + fVar439 * fVar288;
    fVar344 = (fVar368 * fVar241 + fVar344 * fVar441) * fVar241 + fVar441 * fVar289;
    fVar368 = (fVar377 * fVar252 + fVar359 * fVar434) * fVar252 + fVar434 * fVar290;
    fVar313 = (fVar377 * fVar423 + fVar359 * fVar438) * fVar423 + fVar438 * fVar294;
    fVar314 = (fVar377 * fVar433 + fVar359 * fVar439) * fVar433 + fVar439 * fVar296;
    fVar377 = (fVar377 * fVar241 + fVar359 * fVar441) * fVar241 + fVar441 * fVar297;
    fVar274 = fVar274 * fVar252 + (fVar443 * fVar252 + fVar387 * fVar434) * fVar434;
    fVar286 = fVar286 * fVar423 + (fVar443 * fVar423 + fVar387 * fVar438) * fVar438;
    fVar359 = fVar288 * fVar433 + (fVar443 * fVar433 + fVar387 * fVar439) * fVar439;
    fVar289 = fVar289 * fVar241 + (fVar443 * fVar241 + fVar387 * fVar441) * fVar441;
    fVar290 = fVar290 * fVar252 + (fVar450 * fVar252 + fVar396 * fVar434) * fVar434;
    fVar294 = fVar294 * fVar423 + (fVar450 * fVar423 + fVar396 * fVar438) * fVar438;
    fVar296 = fVar296 * fVar433 + (fVar450 * fVar433 + fVar396 * fVar439) * fVar439;
    fVar297 = fVar297 * fVar241 + (fVar450 * fVar241 + fVar396 * fVar441) * fVar441;
    local_388 = fVar252 * fVar251 + fVar434 * fVar274;
    fStack_384 = fVar423 * fVar431 + fVar438 * fVar286;
    fStack_380 = fVar433 * fVar272 + fVar439 * fVar359;
    fStack_37c = fVar241 * fVar344 + fVar441 * fVar289;
    fVar404 = fVar252 * fVar368 + fVar434 * fVar290;
    fVar415 = fVar423 * fVar313 + fVar438 * fVar294;
    fVar419 = fVar433 * fVar314 + fVar439 * fVar296;
    fVar421 = fVar241 * fVar377 + fVar441 * fVar297;
    fVar288 = (fVar286 - fVar431) * 3.0 * fVar424;
    fVar359 = (fVar359 - fVar272) * 3.0 * fVar424;
    fVar344 = (fVar289 - fVar344) * 3.0 * fVar424;
    fVar289 = (fVar294 - fVar313) * 3.0 * fVar424;
    fVar294 = (fVar296 - fVar314) * 3.0 * fVar424;
    fVar296 = (fVar297 - fVar377) * 3.0 * fVar424;
    local_358._4_4_ = fStack_380;
    local_358._0_4_ = fStack_384;
    local_358._8_4_ = fStack_37c;
    local_358._12_4_ = 0;
    local_368 = local_388 + (fVar274 - fVar251) * 3.0 * fVar424;
    fStack_364 = fStack_384 + fVar288;
    fStack_360 = fStack_380 + fVar359;
    fStack_35c = fStack_37c + fVar344;
    fVar251 = fVar404 + (fVar290 - fVar368) * 3.0 * fVar424;
    fVar431 = fVar415 + fVar289;
    fVar272 = fVar419 + fVar294;
    fVar286 = fVar421 + fVar296;
    local_378._0_4_ = fStack_384 - fVar288;
    local_378._4_4_ = fStack_380 - fVar359;
    local_378._8_4_ = fStack_37c - fVar344;
    local_378._12_4_ = 0;
    auVar153._0_4_ = fVar415 - fVar289;
    auVar153._4_4_ = fVar419 - fVar294;
    auVar153._8_4_ = fVar421 - fVar296;
    auVar153._12_4_ = 0;
    fVar359 = fVar363 * fVar252 + fVar452 * fVar434;
    fVar289 = fVar363 * fVar423 + fVar452 * fVar438;
    fVar290 = fVar363 * fVar433 + fVar452 * fVar439;
    fVar294 = fVar363 * fVar241 + fVar452 * fVar441;
    fVar296 = fVar364 * fVar252 + fVar454 * fVar434;
    fVar297 = fVar364 * fVar423 + fVar454 * fVar438;
    fVar368 = fVar364 * fVar433 + fVar454 * fVar439;
    fVar313 = fVar364 * fVar241 + fVar454 * fVar441;
    fVar274 = (fVar380 * fVar252 + fVar363 * fVar434) * fVar252 + fVar434 * fVar359;
    fVar344 = (fVar380 * fVar423 + fVar363 * fVar438) * fVar423 + fVar438 * fVar289;
    fVar288 = (fVar380 * fVar433 + fVar363 * fVar439) * fVar433 + fVar439 * fVar290;
    fVar314 = (fVar380 * fVar241 + fVar363 * fVar441) * fVar241 + fVar441 * fVar294;
    fVar443 = (fVar383 * fVar252 + fVar364 * fVar434) * fVar252 + fVar434 * fVar296;
    fVar450 = (fVar383 * fVar423 + fVar364 * fVar438) * fVar423 + fVar438 * fVar297;
    fVar381 = (fVar383 * fVar433 + fVar364 * fVar439) * fVar433 + fVar439 * fVar368;
    fVar384 = (fVar383 * fVar241 + fVar364 * fVar441) * fVar241 + fVar441 * fVar313;
    fVar377 = fVar359 * fVar252 + (fVar452 * fVar252 + fVar399 * fVar434) * fVar434;
    fVar363 = fVar289 * fVar423 + (fVar452 * fVar423 + fVar399 * fVar438) * fVar438;
    fVar364 = fVar290 * fVar433 + (fVar452 * fVar433 + fVar399 * fVar439) * fVar439;
    fVar380 = fVar294 * fVar241 + (fVar452 * fVar241 + fVar399 * fVar441) * fVar441;
    fVar396 = fVar296 * fVar252 + (fVar454 * fVar252 + fVar400 * fVar434) * fVar434;
    fVar383 = fVar297 * fVar423 + (fVar454 * fVar423 + fVar400 * fVar438) * fVar438;
    fVar387 = fVar368 * fVar433 + (fVar454 * fVar433 + fVar400 * fVar439) * fVar439;
    fVar399 = fVar313 * fVar241 + (fVar454 * fVar241 + fVar400 * fVar441) * fVar441;
    fVar296 = fVar252 * fVar274 + fVar434 * fVar377;
    fVar297 = fVar423 * fVar344 + fVar438 * fVar363;
    fVar368 = fVar433 * fVar288 + fVar439 * fVar364;
    fVar313 = fVar241 * fVar314 + fVar441 * fVar380;
    fVar359 = fVar252 * fVar443 + fVar434 * fVar396;
    fVar289 = fVar423 * fVar450 + fVar438 * fVar383;
    fVar290 = fVar433 * fVar381 + fVar439 * fVar387;
    fVar294 = fVar241 * fVar384 + fVar441 * fVar399;
    fVar252 = (fVar363 - fVar344) * 3.0 * fVar424;
    fVar433 = (fVar364 - fVar288) * 3.0 * fVar424;
    fVar344 = (fVar380 - fVar314) * 3.0 * fVar424;
    fVar380 = (fVar383 - fVar450) * 3.0 * fVar424;
    fVar383 = (fVar387 - fVar381) * 3.0 * fVar424;
    fVar387 = (fVar399 - fVar384) * 3.0 * fVar424;
    fVar381 = fVar296 + (fVar377 - fVar274) * 3.0 * fVar424;
    fVar384 = fVar297 + fVar252;
    fVar400 = fVar368 + fVar433;
    fVar434 = fVar313 + fVar344;
    fVar396 = fVar359 + (fVar396 - fVar443) * 3.0 * fVar424;
    fVar399 = fVar289 + fVar380;
    fVar443 = fVar290 + fVar383;
    fVar450 = fVar294 + fVar387;
    fVar252 = fVar297 - fVar252;
    fVar433 = fVar368 - fVar433;
    fVar344 = fVar313 - fVar344;
    fVar380 = fVar289 - fVar380;
    fVar383 = fVar290 - fVar383;
    fVar387 = fVar294 - fVar387;
    fVar423 = (fVar297 - fStack_384) + (fVar296 - local_388);
    fVar241 = (fVar368 - fStack_380) + (fVar297 - fStack_384);
    fVar274 = (fVar313 - fStack_37c) + (fVar368 - fStack_380);
    fVar288 = (fVar313 - fStack_37c) + 0.0;
    fVar314 = (fVar289 - fVar415) + (fVar359 - fVar404);
    fVar377 = (fVar290 - fVar419) + (fVar289 - fVar415);
    fVar363 = (fVar294 - fVar421) + (fVar290 - fVar419);
    fVar364 = (fVar294 - fVar421) + 0.0;
    auVar305._0_8_ =
         CONCAT44(fVar415 * fVar241 - fStack_384 * fVar377,fVar404 * fVar423 - local_388 * fVar314);
    auVar305._8_4_ = fVar419 * fVar274 - fStack_380 * fVar363;
    auVar305._12_4_ = fVar421 * fVar288 - fStack_37c * fVar364;
    auVar262._0_4_ = fVar251 * fVar423 - local_368 * fVar314;
    auVar262._4_4_ = fVar431 * fVar241 - fStack_364 * fVar377;
    auVar262._8_4_ = fVar272 * fVar274 - fStack_360 * fVar363;
    auVar262._12_4_ = fVar286 * fVar288 - fStack_35c * fVar364;
    auVar276._0_8_ =
         CONCAT44(auVar153._4_4_ * fVar241 - fVar377 * local_378._4_4_,
                  auVar153._0_4_ * fVar423 - fVar314 * local_378._0_4_);
    auVar276._8_4_ = auVar153._8_4_ * fVar274 - fVar363 * local_378._8_4_;
    auVar276._12_4_ = fVar288 * 0.0 - fVar364 * 0.0;
    auVar409._0_4_ = fVar423 * fVar415 - fVar314 * fStack_384;
    auVar409._4_4_ = fVar241 * fVar419 - fVar377 * fStack_380;
    auVar409._8_4_ = fVar274 * fVar421 - fVar363 * fStack_37c;
    auVar409._12_4_ = fVar288 * 0.0 - fVar364 * 0.0;
    auVar349._0_8_ =
         CONCAT44(fVar289 * fVar241 - fVar297 * fVar377,fVar359 * fVar423 - fVar296 * fVar314);
    auVar349._8_4_ = fVar290 * fVar274 - fVar368 * fVar363;
    auVar349._12_4_ = fVar294 * fVar288 - fVar313 * fVar364;
    auVar428._0_4_ = fVar396 * fVar423 - fVar381 * fVar314;
    auVar428._4_4_ = fVar399 * fVar241 - fVar384 * fVar377;
    auVar428._8_4_ = fVar443 * fVar274 - fVar400 * fVar363;
    auVar428._12_4_ = fVar450 * fVar288 - fVar434 * fVar364;
    auVar319._0_8_ =
         CONCAT44(fVar383 * fVar241 - fVar377 * fVar433,fVar380 * fVar423 - fVar314 * fVar252);
    auVar319._8_4_ = fVar387 * fVar274 - fVar363 * fVar344;
    auVar319._12_4_ = fVar288 * 0.0 - fVar364 * 0.0;
    auVar163._0_4_ = fVar423 * fVar289 - fVar314 * fVar297;
    auVar163._4_4_ = fVar241 * fVar290 - fVar377 * fVar368;
    auVar163._8_4_ = fVar274 * fVar294 - fVar363 * fVar313;
    auVar163._12_4_ = fVar288 * 0.0 - fVar364 * 0.0;
    auVar187._8_4_ = auVar305._8_4_;
    auVar187._0_8_ = auVar305._0_8_;
    auVar187._12_4_ = auVar305._12_4_;
    auVar126 = minps(auVar187,auVar262);
    auVar185 = maxps(auVar305,auVar262);
    auVar263._8_4_ = auVar276._8_4_;
    auVar263._0_8_ = auVar276._0_8_;
    auVar263._12_4_ = auVar276._12_4_;
    auVar256 = minps(auVar263,auVar409);
    auVar126 = minps(auVar126,auVar256);
    auVar256 = maxps(auVar276,auVar409);
    auVar125 = maxps(auVar185,auVar256);
    auVar264._8_4_ = auVar349._8_4_;
    auVar264._0_8_ = auVar349._0_8_;
    auVar264._12_4_ = auVar349._12_4_;
    auVar256 = minps(auVar264,auVar428);
    auVar350 = maxps(auVar349,auVar428);
    auVar277._8_4_ = auVar319._8_4_;
    auVar277._0_8_ = auVar319._0_8_;
    auVar277._12_4_ = auVar319._12_4_;
    auVar185 = minps(auVar277,auVar163);
    auVar256 = minps(auVar256,auVar185);
    auVar126 = minps(auVar126,auVar256);
    auVar256 = maxps(auVar319,auVar163);
    auVar256 = maxps(auVar350,auVar256);
    auVar256 = maxps(auVar125,auVar256);
    bVar104 = auVar126._4_4_ <= fVar238;
    bVar33 = auVar126._8_4_ <= fVar238;
    auVar92._4_4_ = -(uint)bVar33;
    auVar92._0_4_ = -(uint)bVar104;
    auVar92._8_4_ = -(uint)(auVar126._12_4_ <= fVar238);
    auVar92._12_4_ = 0;
    auVar191 = auVar92 << 0x20;
    bVar96 = (-fVar238 <= auVar256._0_4_ && auVar126._0_4_ <= fVar238) && bVar35;
    auVar306._0_4_ = -(uint)bVar96;
    bVar97 = (-fVar238 <= auVar256._4_4_ && bVar104) && bVar36;
    auVar306._4_4_ = -(uint)bVar97;
    bVar104 = (-fVar238 <= auVar256._8_4_ && bVar33) && bVar37;
    auVar306._8_4_ = -(uint)bVar104;
    auVar306._12_4_ = 0;
    uVar106 = movmskps((int)uVar108,auVar306);
    uVar109 = (ulong)uVar106;
    if (uVar106 != 0) {
      fVar423 = (fVar297 - fVar296) + (fStack_384 - local_388);
      fVar241 = (fVar368 - fVar297) + (fStack_380 - fStack_384);
      fVar274 = (fVar313 - fVar368) + (fStack_37c - fStack_380);
      fVar288 = (0.0 - fVar313) + (0.0 - fStack_37c);
      fVar314 = (fVar289 - fVar359) + (fVar415 - fVar404);
      fVar377 = (fVar290 - fVar289) + (fVar419 - fVar415);
      fVar363 = (fVar294 - fVar290) + (fVar421 - fVar419);
      fVar364 = (0.0 - fVar294) + (0.0 - fVar421);
      auVar435._0_8_ =
           CONCAT44(fVar415 * fVar241 - fStack_384 * fVar377,fVar404 * fVar423 - local_388 * fVar314
                   );
      auVar435._8_4_ = fVar419 * fVar274 - fStack_380 * fVar363;
      auVar435._12_4_ = fVar421 * fVar288 - fStack_37c * fVar364;
      auVar265._0_4_ = fVar251 * fVar423 - local_368 * fVar314;
      auVar265._4_4_ = fVar431 * fVar241 - fStack_364 * fVar377;
      auVar265._8_4_ = fVar272 * fVar274 - fStack_360 * fVar363;
      auVar265._12_4_ = fVar286 * fVar288 - fStack_35c * fVar364;
      auVar320._0_8_ =
           CONCAT44(auVar153._4_4_ * fVar241 - local_378._4_4_ * fVar377,
                    auVar153._0_4_ * fVar423 - local_378._0_4_ * fVar314);
      auVar320._8_4_ = auVar153._8_4_ * fVar274 - local_378._8_4_ * fVar363;
      auVar320._12_4_ = fVar288 * 0.0 - fVar364 * 0.0;
      auVar278._0_4_ = fVar415 * fVar423 - fStack_384 * fVar314;
      auVar278._4_4_ = fVar419 * fVar241 - fStack_380 * fVar377;
      auVar278._8_4_ = fVar421 * fVar274 - fStack_37c * fVar363;
      auVar278._12_4_ = fVar288 * 0.0 - fVar364 * 0.0;
      auVar232._0_8_ =
           CONCAT44(fVar289 * fVar241 - fVar297 * fVar377,fVar359 * fVar423 - fVar296 * fVar314);
      auVar232._8_4_ = fVar290 * fVar274 - fVar368 * fVar363;
      auVar232._12_4_ = fVar294 * fVar288 - fVar313 * fVar364;
      auVar370._0_4_ = fVar396 * fVar423 - fVar381 * fVar314;
      auVar370._4_4_ = fVar399 * fVar241 - fVar384 * fVar377;
      auVar370._8_4_ = fVar443 * fVar274 - fVar400 * fVar363;
      auVar370._12_4_ = fVar450 * fVar288 - fVar434 * fVar364;
      auVar410._0_8_ =
           CONCAT44(fVar383 * fVar241 - fVar433 * fVar377,fVar380 * fVar423 - fVar252 * fVar314);
      auVar410._8_4_ = fVar387 * fVar274 - fVar344 * fVar363;
      auVar410._12_4_ = fVar288 * 0.0 - fVar364 * 0.0;
      auVar163._0_4_ = fVar423 * fVar289 - fVar314 * fVar297;
      auVar163._4_4_ = fVar241 * fVar290 - fVar377 * fVar368;
      auVar163._8_4_ = fVar274 * fVar294 - fVar363 * fVar313;
      auVar163._12_4_ = fVar288 * 0.0 - fVar364 * 0.0;
      auVar188._8_4_ = auVar435._8_4_;
      auVar188._0_8_ = auVar435._0_8_;
      auVar188._12_4_ = auVar435._12_4_;
      auVar126 = minps(auVar188,auVar265);
      auVar185 = maxps(auVar435,auVar265);
      auVar266._8_4_ = auVar320._8_4_;
      auVar266._0_8_ = auVar320._0_8_;
      auVar266._12_4_ = auVar320._12_4_;
      auVar256 = minps(auVar266,auVar278);
      auVar126 = minps(auVar126,auVar256);
      auVar256 = maxps(auVar320,auVar278);
      auVar350 = maxps(auVar185,auVar256);
      auVar267._8_4_ = auVar232._8_4_;
      auVar267._0_8_ = auVar232._0_8_;
      auVar267._12_4_ = auVar232._12_4_;
      auVar185 = minps(auVar267,auVar370);
      auVar256 = maxps(auVar232,auVar370);
      auVar279._8_4_ = auVar410._8_4_;
      auVar279._0_8_ = auVar410._0_8_;
      auVar279._12_4_ = auVar410._12_4_;
      auVar125 = minps(auVar279,auVar163);
      auVar185 = minps(auVar185,auVar125);
      auVar126 = minps(auVar126,auVar185);
      auVar185 = maxps(auVar410,auVar163);
      auVar256 = maxps(auVar256,auVar185);
      auVar256 = maxps(auVar350,auVar256);
      bVar33 = auVar126._4_4_ <= fVar238;
      bVar34 = auVar126._8_4_ <= fVar238;
      auVar93._4_4_ = -(uint)bVar34;
      auVar93._0_4_ = -(uint)bVar33;
      auVar93._8_4_ = -(uint)(auVar126._12_4_ <= fVar238);
      auVar93._12_4_ = 0;
      auVar191 = auVar93 << 0x20;
      auVar436._0_4_ = -(uint)((-fVar238 <= auVar256._0_4_ && auVar126._0_4_ <= fVar238) && bVar96);
      auVar436._4_4_ = -(uint)((-fVar238 <= auVar256._4_4_ && bVar33) && bVar97);
      auVar436._8_4_ = -(uint)((-fVar238 <= auVar256._8_4_ && bVar34) && bVar104);
      auVar436._12_4_ = 0;
      uVar106 = movmskps(uVar106,auVar436);
      uVar109 = (ulong)uVar106;
      if (uVar106 != 0) {
        uVar109 = (ulong)(byte)uVar106;
        mask_stack[uVar120] = uVar106 & 0xff;
        cu_stack[uVar120] = local_518;
        cv_stack[uVar120].lower = (float)local_538._0_4_;
        cv_stack[uVar120].upper = (float)local_538._4_4_;
        uVar120 = uVar120 + 1;
        auVar163 = _local_538;
      }
    }
LAB_003b4f40:
    _local_508 = auVar153;
    auVar126 = _local_508;
    if (uVar120 == 0) {
      if (bVar112 != 0) goto LAB_003b60c5;
      fVar168 = *(float *)(pRVar115 + k * 4 + 0x80);
      auVar199._4_4_ = -(uint)(fVar122 <= fVar168);
      auVar199._0_4_ = -(uint)(fVar416 <= fVar168);
      auVar199._8_4_ = -(uint)(fVar166 <= fVar168);
      auVar199._12_4_ = -(uint)(fVar167 <= fVar168);
      uVar118 = movmskps((int)uVar109,auVar199);
      uVar117 = uVar117 & uVar117 + 0xf & uVar118;
      goto LAB_003b3ae2;
    }
    uVar106 = uVar120 - 1;
    uVar108 = (ulong)uVar106;
    uVar116 = mask_stack[uVar108];
    local_538._0_4_ = cv_stack[uVar108].lower;
    local_538._4_4_ = cv_stack[uVar108].upper;
    fStack_530 = 0.0;
    fStack_52c = 0.0;
    uVar109 = 0;
    if (uVar116 != 0) {
      for (; (uVar116 >> uVar109 & 1) == 0; uVar109 = uVar109 + 1) {
      }
    }
    uVar116 = uVar116 - 1 & uVar116;
    mask_stack[uVar108] = uVar116;
    if (uVar116 == 0) {
      uVar120 = uVar106;
    }
    fVar423 = (float)(uVar109 + 1) * 0.33333334;
    fVar431 = auVar163._4_4_ * 0.0;
    fVar433 = auVar191._4_4_ * 0.0;
    fVar251 = cu_stack[uVar108].lower;
    fVar252 = cu_stack[uVar108].upper;
    local_518.lower =
         fVar251 * (1.0 - (float)uVar109 * 0.33333334) + fVar252 * (float)uVar109 * 0.33333334;
    local_518.upper = fVar251 * (1.0 - fVar423) + fVar252 * fVar423;
    fVar423 = fVar251 * (0.0 - fVar431) + fVar252 * fVar431;
    fVar252 = fVar251 * (0.0 - fVar433) + fVar252 * fVar433;
    fVar251 = local_518.upper - local_518.lower;
    if (fVar251 < 0.16666667) {
      fVar274 = 1.0 - (float)local_538._0_4_;
      fVar288 = 1.0 - (float)local_538._0_4_;
      fVar290 = 1.0 - (float)local_538._4_4_;
      fVar294 = 1.0 - (float)local_538._4_4_;
      fVar344 = fVar442 * fVar274 + fVar293 * (float)local_538._0_4_;
      fVar286 = fVar449 * fVar288 + fVar317 * (float)local_538._0_4_;
      fVar359 = fVar442 * fVar290 + fVar293 * (float)local_538._4_4_;
      fVar289 = fVar449 * fVar294 + fVar317 * (float)local_538._4_4_;
      fVar431 = fVar360 * fVar274 + fVar334 * (float)local_538._0_4_;
      fVar433 = fVar402 * fVar288 + fVar379 * (float)local_538._0_4_;
      fVar241 = fVar360 * fVar290 + fVar334 * (float)local_538._4_4_;
      fVar272 = fVar402 * fVar294 + fVar379 * (float)local_538._4_4_;
      fVar380 = fVar398 * fVar274 + fVar330 * (float)local_538._0_4_;
      fVar387 = fVar414 * fVar288 + fVar336 * (float)local_538._0_4_;
      fVar399 = fVar398 * fVar290 + fVar330 * (float)local_538._4_4_;
      fVar450 = fVar414 * fVar294 + fVar336 * (float)local_538._4_4_;
      fVar314 = (fVar274 * fVar343 + (float)local_538._0_4_ * fVar242) - fVar380;
      fVar377 = (fVar288 * fVar361 + (float)local_538._0_4_ * fVar240) - fVar387;
      fVar363 = (fVar290 * fVar343 + (float)local_538._4_4_ * fVar242) - fVar399;
      fVar364 = (fVar294 * fVar361 + (float)local_538._4_4_ * fVar240) - fVar450;
      fVar274 = local_518.lower * (fVar380 - fVar431) + fVar431;
      fVar288 = local_518.lower * (fVar387 - fVar433) + fVar433;
      fVar290 = local_518.lower * (fVar399 - fVar241) + fVar241;
      fVar294 = local_518.lower * (fVar450 - fVar272) + fVar272;
      fVar383 = (fVar380 - fVar431) * local_518.upper + fVar431;
      fVar396 = (fVar387 - fVar433) * local_518.upper + fVar433;
      fVar443 = (fVar399 - fVar241) * local_518.upper + fVar241;
      fVar381 = (fVar450 - fVar272) * local_518.upper + fVar272;
      fVar296 = local_518.lower * (fVar431 - fVar344) + fVar344;
      fVar297 = local_518.lower * (fVar433 - fVar286) + fVar286;
      fVar368 = local_518.lower * (fVar241 - fVar359) + fVar359;
      fVar313 = local_518.lower * (fVar272 - fVar289) + fVar289;
      fVar296 = (fVar274 - fVar296) * local_518.lower + fVar296;
      fVar297 = (fVar288 - fVar297) * local_518.lower + fVar297;
      fVar368 = (fVar290 - fVar368) * local_518.lower + fVar368;
      fVar313 = (fVar294 - fVar313) * local_518.lower + fVar313;
      fVar274 = (((local_518.lower * fVar314 + fVar380) - fVar274) * local_518.lower + fVar274) -
                fVar296;
      fVar288 = (((local_518.lower * fVar377 + fVar387) - fVar288) * local_518.lower + fVar288) -
                fVar297;
      fVar290 = (((local_518.lower * fVar363 + fVar399) - fVar290) * local_518.lower + fVar290) -
                fVar368;
      fVar294 = (((local_518.lower * fVar364 + fVar450) - fVar294) * local_518.lower + fVar294) -
                fVar313;
      fVar296 = local_518.lower * fVar274 + fVar296;
      fVar297 = local_518.lower * fVar288 + fVar297;
      fVar368 = local_518.lower * fVar290 + fVar368;
      fVar313 = local_518.lower * fVar294 + fVar313;
      fVar344 = (fVar431 - fVar344) * local_518.upper + fVar344;
      fVar286 = (fVar433 - fVar286) * local_518.upper + fVar286;
      fVar359 = (fVar241 - fVar359) * local_518.upper + fVar359;
      fVar289 = (fVar272 - fVar289) * local_518.upper + fVar289;
      fVar344 = (fVar383 - fVar344) * local_518.upper + fVar344;
      fVar286 = (fVar396 - fVar286) * local_518.upper + fVar286;
      fVar359 = (fVar443 - fVar359) * local_518.upper + fVar359;
      fVar289 = (fVar381 - fVar289) * local_518.upper + fVar289;
      fVar433 = (((fVar314 * local_518.upper + fVar380) - fVar383) * local_518.upper + fVar383) -
                fVar344;
      fVar241 = (((fVar377 * local_518.upper + fVar387) - fVar396) * local_518.upper + fVar396) -
                fVar286;
      fVar272 = (((fVar363 * local_518.upper + fVar399) - fVar443) * local_518.upper + fVar443) -
                fVar359;
      fVar396 = (((fVar364 * local_518.upper + fVar450) - fVar381) * local_518.upper + fVar381) -
                fVar289;
      fVar344 = local_518.upper * fVar433 + fVar344;
      fVar286 = local_518.upper * fVar241 + fVar286;
      fVar359 = local_518.upper * fVar272 + fVar359;
      fVar289 = local_518.upper * fVar396 + fVar289;
      fVar431 = fVar251 * 0.33333334;
      fVar314 = fVar274 * (float)DAT_01f4afa0 * fVar431 + fVar296;
      fVar377 = fVar288 * DAT_01f4afa0._4_4_ * fVar431 + fVar297;
      fVar363 = fVar290 * DAT_01f4afa0._8_4_ * fVar431 + fVar368;
      fVar364 = fVar294 * DAT_01f4afa0._12_4_ * fVar431 + fVar313;
      fVar380 = fVar344 - fVar431 * fVar433 * (float)DAT_01f4afa0;
      fVar383 = fVar286 - fVar431 * fVar241 * DAT_01f4afa0._4_4_;
      fVar387 = fVar359 - fVar431 * fVar272 * DAT_01f4afa0._8_4_;
      fVar396 = fVar289 - fVar431 * fVar396 * DAT_01f4afa0._12_4_;
      auVar40._4_8_ = DAT_01f4afa0._8_8_;
      auVar40._0_4_ = fVar286;
      auVar321._0_8_ = auVar40._0_8_ << 0x20;
      auVar321._8_4_ = fVar359;
      auVar321._12_4_ = fVar289;
      fVar274 = (fVar359 - fVar344) + (fVar368 - fVar296);
      fVar288 = (fVar289 - fVar286) + (fVar313 - fVar297);
      auVar351._0_4_ = fVar383 * fVar288;
      auVar351._4_4_ = fVar383 * fVar288;
      auVar351._8_4_ = fVar396 * fVar288;
      auVar351._12_4_ = fVar396 * fVar288;
      fVar431 = fVar296 * fVar274 + fVar297 * fVar288;
      fVar433 = fVar368 * fVar274 + fVar313 * fVar288;
      fVar290 = fVar314 * fVar274 + fVar377 * fVar288;
      fVar294 = fVar363 * fVar274 + fVar364 * fVar288;
      fVar399 = fVar380 * fVar274 + auVar351._0_4_;
      auVar307._0_8_ = CONCAT44(fVar383 * fVar274 + auVar351._4_4_,fVar399);
      auVar307._8_4_ = fVar387 * fVar274 + auVar351._8_4_;
      auVar307._12_4_ = fVar396 * fVar274 + auVar351._12_4_;
      fVar272 = fVar274 * fVar344 + fVar288 * fVar286;
      fVar443 = fVar274 * fVar359 + fVar288 * fVar289;
      auVar41._4_8_ = auVar351._8_8_;
      auVar41._0_4_ = fVar377 * fVar274 + fVar377 * fVar288;
      auVar352._0_8_ = auVar41._0_8_ << 0x20;
      auVar352._8_4_ = fVar294;
      auVar352._12_4_ = fVar364 * fVar274 + fVar364 * fVar288;
      fVar241 = fVar290;
      if (fVar290 <= fVar431) {
        fVar241 = fVar431;
        fVar431 = fVar290;
      }
      auVar353._8_8_ = auVar352._8_8_;
      auVar353._0_8_ = auVar353._8_8_;
      auVar154._8_4_ = auVar307._8_4_;
      auVar154._0_8_ = auVar307._0_8_;
      auVar154._12_4_ = auVar307._12_4_;
      if (fVar272 <= fVar399) {
        auVar154._0_4_ = fVar272;
      }
      if (auVar154._0_4_ <= fVar431) {
        fVar431 = auVar154._0_4_;
      }
      auVar42._4_8_ = auVar154._8_8_;
      auVar42._0_4_ = fVar274 * fVar286 + fVar288 * fVar286;
      auVar155._0_8_ = auVar42._0_8_ << 0x20;
      auVar155._8_4_ = fVar443;
      auVar155._12_4_ = fVar274 * fVar289 + fVar288 * fVar289;
      if (fVar272 <= fVar399) {
        fVar272 = fVar399;
      }
      auVar163._8_8_ = auVar155._8_8_;
      auVar163._0_8_ = auVar163._8_8_;
      if (fVar272 <= fVar241) {
        fVar272 = fVar241;
      }
      if (fVar294 <= fVar433) {
        auVar353._0_4_ = fVar433;
        fVar433 = fVar294;
      }
      auVar189._8_4_ = auVar307._8_4_;
      auVar189._0_8_ = auVar307._8_8_;
      auVar189._12_4_ = auVar307._12_4_;
      if (fVar443 <= auVar307._8_4_) {
        auVar189._0_4_ = fVar443;
      }
      if (auVar189._0_4_ <= fVar433) {
        fVar433 = auVar189._0_4_;
      }
      if (fVar443 <= auVar307._8_4_) {
        auVar163._0_4_ = auVar307._8_4_;
      }
      if (auVar163._0_4_ <= auVar353._0_4_) {
        auVar163._0_4_ = auVar353._0_4_;
      }
      uVar43 = (undefined3)(uVar106 >> 8);
      uVar109 = (ulong)CONCAT31(uVar43,3 < uVar120);
      fVar241 = auVar163._0_4_;
      if ((0.0001 <= fVar431) || (fVar241 <= -0.0001)) break;
      goto LAB_003b529b;
    }
  } while( true );
  auVar191._0_12_ = ZEXT812(0x38d1b717);
  auVar191._12_4_ = 0;
  if ((fVar433 < 0.0001 && -0.0001 < fVar272) ||
     ((fVar431 < 0.0001 && -0.0001 < fVar272 ||
      (auVar153 = _local_508, fVar433 < 0.0001 && -0.0001 < fVar241)))) {
LAB_003b529b:
    local_508 = (undefined1  [8])auVar321._8_8_;
    auVar153 = _local_508;
    local_4f8 = (RayK<4> *)CONCAT44(fVar289,fVar359);
    bVar104 = 3 < uVar120 || fVar251 < 0.001;
    uVar109 = (ulong)CONCAT31(uVar43,bVar104);
    fVar288 = (float)(~-(uint)(fVar431 < 0.0) & 0x3f800000 | -(uint)(fVar431 < 0.0) & 0xbf800000);
    fVar290 = (float)(~-(uint)(fVar272 < 0.0) & 0x3f800000 | -(uint)(fVar272 < 0.0) & 0xbf800000);
    fVar274 = 0.0;
    if ((fVar288 == fVar290) && (!NAN(fVar288) && !NAN(fVar290))) {
      fVar274 = INFINITY;
    }
    fVar294 = 0.0;
    if ((fVar288 == fVar290) && (!NAN(fVar288) && !NAN(fVar290))) {
      fVar294 = -INFINITY;
    }
    fVar399 = (float)(~-(uint)(fVar433 < 0.0) & 0x3f800000 | -(uint)(fVar433 < 0.0) & 0xbf800000);
    if ((fVar288 != fVar399) || (fVar443 = fVar294, NAN(fVar288) || NAN(fVar399))) {
      if ((fVar433 != fVar431) || (NAN(fVar433) || NAN(fVar431))) {
        fVar433 = -fVar431 / (fVar433 - fVar431);
        fVar433 = (1.0 - fVar433) * 0.0 + fVar433;
        fVar443 = fVar433;
      }
      else {
        fVar433 = 0.0;
        if ((fVar431 != 0.0) || (fVar443 = 1.0, NAN(fVar431))) {
          fVar433 = INFINITY;
          fVar443 = -INFINITY;
        }
      }
      if (fVar433 <= fVar274) {
        fVar274 = fVar433;
      }
      if (fVar443 <= fVar294) {
        fVar443 = fVar294;
      }
    }
    fVar431 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar241 < 0.0) * 4);
    if ((fVar290 != fVar431) || (fVar433 = fVar443, NAN(fVar290) || NAN(fVar431))) {
      if ((fVar241 != fVar272) || (NAN(fVar241) || NAN(fVar272))) {
        fVar288 = -fVar272 / (fVar241 - fVar272);
        fVar288 = (1.0 - fVar288) * 0.0 + fVar288;
        fVar433 = fVar288;
      }
      else {
        fVar288 = 0.0;
        if ((fVar272 != 0.0) || (fVar433 = 1.0, NAN(fVar272))) {
          fVar288 = INFINITY;
          fVar433 = -INFINITY;
        }
      }
      if (fVar288 <= fVar274) {
        fVar274 = fVar288;
      }
      if (fVar433 <= fVar443) {
        fVar433 = fVar443;
      }
    }
    if ((fVar399 != fVar431) || (NAN(fVar399) || NAN(fVar431))) {
      fVar274 = (float)(~-(uint)(fVar274 < 1.0) & 0x3f800000 |
                       (uint)fVar274 & -(uint)(fVar274 < 1.0));
      fVar433 = (float)(~-(uint)(fVar433 < 1.0) & (uint)fVar433 |
                       -(uint)(fVar433 < 1.0) & 0x3f800000);
    }
    fStack_500 = auVar126._8_4_;
    fStack_4fc = auVar126._12_4_;
    auVar190._0_8_ =
         CONCAT44(~-(uint)(fVar433 < 1.0),~-(uint)(fVar274 < 0.0) & (uint)fVar274) &
         0x3f800000ffffffff;
    auVar190._8_8_ = 0;
    auVar191 = auVar190 | ZEXT416((uint)fVar433 & -(uint)(fVar433 < 1.0)) << 0x20;
    fVar431 = auVar191._4_4_;
    auVar163._4_4_ = fVar431;
    auVar163._0_4_ = fVar431;
    auVar163._8_4_ = fVar431;
    auVar163._12_4_ = fVar431;
    if (auVar191._0_4_ <= fVar431) {
      fVar433 = auVar191._0_4_ + -0.1;
      fVar272 = auVar191._8_4_ + 0.0;
      fVar274 = auVar191._12_4_ + 0.0;
      uVar106 = -(uint)(fVar431 + 0.1 < 1.0);
      fVar433 = (float)(~-(uint)(fVar433 < 0.0) & (uint)fVar433);
      fVar431 = (float)(~uVar106 & 0x3f800000 | (uint)(fVar431 + 0.1) & uVar106);
      fVar399 = 1.0 - fVar433;
      fVar443 = 1.0 - fVar433;
      fVar450 = 1.0 - fVar431;
      fVar381 = 1.0 - fVar431;
      fVar288 = fVar296 * fVar399 + fVar368 * fVar433;
      fVar290 = fVar297 * fVar443 + fVar313 * fVar433;
      fVar294 = fVar296 * fVar450 + fVar368 * fVar431;
      fVar296 = fVar297 * fVar381 + fVar313 * fVar431;
      fVar297 = fVar314 * fVar399 + fVar363 * fVar433;
      fVar368 = fVar377 * fVar443 + fVar364 * fVar433;
      fVar313 = fVar314 * fVar450 + fVar363 * fVar431;
      fVar314 = fVar377 * fVar381 + fVar364 * fVar431;
      fVar377 = fVar380 * fVar399 + fVar387 * fVar433;
      fVar363 = fVar383 * fVar443 + fVar396 * fVar433;
      fVar364 = fVar380 * fVar450 + fVar387 * fVar431;
      fVar380 = fVar383 * fVar381 + fVar396 * fVar431;
      fVar359 = fVar399 * fVar344 + fVar359 * fVar433;
      fVar289 = fVar443 * fVar286 + fVar289 * fVar433;
      fVar383 = fVar450 * fVar344 + fStack_500 * fVar431;
      fVar387 = fVar381 * fVar286 + fStack_4fc * fVar431;
      fVar344 = (float)local_538._4_4_ * fVar272;
      fVar286 = (float)local_538._4_4_ * fVar274;
      fVar396 = (float)local_538._0_4_ * (1.0 - fVar431);
      fStack_530 = (float)local_538._0_4_ * (0.0 - fVar272);
      fStack_52c = (float)local_538._0_4_ * (0.0 - fVar274);
      local_538._0_4_ = (float)local_538._0_4_ * (1.0 - fVar433) + (float)local_538._4_4_ * fVar433;
      local_538._4_4_ = fVar396 + (float)local_538._4_4_ * fVar431;
      fStack_530 = fStack_530 + fVar344;
      fStack_52c = fStack_52c + fVar286;
      fVar251 = 1.0 / fVar251;
      auVar192._0_4_ = fVar383 - fVar359;
      auVar192._4_4_ = fVar387 - fVar289;
      auVar192._8_4_ = fVar383 - fVar383;
      auVar192._12_4_ = fVar387 - fVar387;
      auVar249._0_8_ = CONCAT44(fVar380 - fVar363,fVar364 - fVar377);
      auVar249._8_4_ = fVar364 - fVar364;
      auVar249._12_4_ = fVar380 - fVar380;
      auVar280._0_4_ = fVar313 - fVar297;
      auVar280._4_4_ = fVar314 - fVar368;
      auVar280._8_4_ = fVar313 - fVar313;
      auVar280._12_4_ = fVar314 - fVar314;
      auVar354._0_8_ = CONCAT44((fVar368 - fVar290) * 3.0,(fVar297 - fVar288) * 3.0);
      auVar354._8_4_ = (fVar313 - fVar294) * 3.0;
      auVar354._12_4_ = (fVar314 - fVar296) * 3.0;
      auVar268._0_8_ = CONCAT44((fVar363 - fVar368) * 3.0,(fVar377 - fVar297) * 3.0);
      auVar268._8_4_ = (fVar364 - fVar313) * 3.0;
      auVar268._12_4_ = (fVar380 - fVar314) * 3.0;
      auVar389._0_4_ = (fVar359 - fVar377) * 3.0;
      auVar389._4_4_ = (fVar289 - fVar363) * 3.0;
      auVar389._8_4_ = (fVar383 - fVar364) * 3.0;
      auVar389._12_4_ = (fVar387 - fVar380) * 3.0;
      auVar308._8_4_ = auVar268._8_4_;
      auVar308._0_8_ = auVar268._0_8_;
      auVar308._12_4_ = auVar268._12_4_;
      auVar256 = minps(auVar308,auVar389);
      auVar126 = maxps(auVar268,auVar389);
      auVar371._8_4_ = auVar354._8_4_;
      auVar371._0_8_ = auVar354._0_8_;
      auVar371._12_4_ = auVar354._12_4_;
      auVar125 = minps(auVar371,auVar256);
      auVar185 = maxps(auVar354,auVar126);
      auVar44._4_8_ = auVar126._8_8_;
      auVar44._0_4_ = auVar125._4_4_;
      auVar269._0_8_ = auVar44._0_8_ << 0x20;
      auVar269._8_4_ = auVar125._8_4_;
      auVar269._12_4_ = auVar125._12_4_;
      auVar270._8_8_ = auVar125._8_8_;
      auVar270._0_8_ = auVar269._8_8_;
      auVar45._4_8_ = auVar256._8_8_;
      auVar45._0_4_ = auVar185._4_4_;
      auVar309._0_8_ = auVar45._0_8_ << 0x20;
      auVar309._8_4_ = auVar185._8_4_;
      auVar309._12_4_ = auVar185._12_4_;
      auVar310._8_8_ = auVar185._8_8_;
      auVar310._0_8_ = auVar309._8_8_;
      auVar256 = minps(auVar125,auVar270);
      auVar126 = maxps(auVar185,auVar310);
      fVar399 = auVar256._0_4_ * fVar251;
      fVar443 = auVar256._4_4_ * fVar251;
      fVar450 = auVar256._8_4_ * fVar251;
      fVar381 = auVar256._12_4_ * fVar251;
      fVar297 = fVar251 * auVar126._0_4_;
      fVar313 = fVar251 * auVar126._4_4_;
      fVar377 = fVar251 * auVar126._8_4_;
      fVar251 = fVar251 * auVar126._12_4_;
      fVar387 = 1.0 / ((float)local_538._4_4_ - (float)local_538._0_4_);
      auVar156._0_8_ = CONCAT44(fVar296 - fVar290,fVar294 - fVar288);
      auVar156._8_4_ = fVar294 - fVar294;
      auVar156._12_4_ = fVar296 - fVar296;
      auVar322._8_4_ = auVar156._8_4_;
      auVar322._0_8_ = auVar156._0_8_;
      auVar322._12_4_ = auVar156._12_4_;
      auVar185 = minps(auVar322,auVar280);
      auVar126 = maxps(auVar156,auVar280);
      auVar233._8_4_ = auVar249._8_4_;
      auVar233._0_8_ = auVar249._0_8_;
      auVar233._12_4_ = auVar249._12_4_;
      auVar256 = minps(auVar233,auVar192);
      auVar185 = minps(auVar185,auVar256);
      auVar256 = maxps(auVar249,auVar192);
      auVar126 = maxps(auVar126,auVar256);
      fVar380 = auVar185._0_4_ * fVar387;
      fVar383 = auVar185._4_4_ * fVar387;
      fVar396 = fVar387 * auVar126._0_4_;
      fVar387 = fVar387 * auVar126._4_4_;
      local_508._4_4_ = local_538._0_4_;
      local_508._0_4_ = local_518.lower;
      fStack_500 = local_518.upper;
      fStack_4fc = (float)local_538._4_4_;
      auVar311._4_4_ = local_538._4_4_;
      auVar311._0_4_ = local_518.upper;
      auVar311._8_4_ = fVar423;
      auVar311._12_4_ = fVar252;
      fVar289 = (local_518.lower + local_518.upper) * 0.5;
      fVar290 = ((float)local_538._0_4_ + (float)local_538._4_4_) * 0.5;
      fVar294 = (local_518.upper + fVar423) * 0.0;
      fVar296 = ((float)local_538._4_4_ + fVar252) * 0.0;
      fVar431 = (fVar360 - fVar442) * fVar289 + fVar442;
      fVar433 = (fVar402 - fVar449) * fVar289 + fVar449;
      fVar272 = (fVar334 - fVar293) * fVar289 + p00_1.field_0.v[2];
      fVar344 = (fVar379 - fVar317) * fVar289 + p00_1.field_0.v[3];
      fVar274 = (fVar398 - fVar360) * fVar289 + fVar360;
      fVar286 = (fVar414 - fVar402) * fVar289 + fVar402;
      fVar288 = (fVar330 - fVar334) * fVar289 + fVar334;
      fVar359 = (fVar336 - fVar379) * fVar289 + fVar379;
      fVar431 = (fVar274 - fVar431) * fVar289 + fVar431;
      fVar433 = (fVar286 - fVar433) * fVar289 + fVar433;
      fVar272 = (fVar288 - fVar272) * fVar289 + fVar272;
      fVar344 = (fVar359 - fVar344) * fVar289 + fVar344;
      fVar274 = ((((fVar343 - fVar398) * fVar289 + fVar398) - fVar274) * fVar289 + fVar274) -
                fVar431;
      fVar286 = ((((fVar361 - fVar414) * fVar289 + fVar414) - fVar286) * fVar289 + fVar286) -
                fVar433;
      fVar288 = ((((fVar242 - fVar330) * fVar289 + fVar330) - fVar288) * fVar289 + fVar288) -
                fVar272;
      fVar359 = ((((fVar240 - fVar336) * fVar289 + fVar336) - fVar359) * fVar289 + fVar359) -
                fVar344;
      fVar431 = fVar289 * fVar274 + fVar431;
      fVar433 = fVar289 * fVar286 + fVar433;
      fVar274 = fVar274 * 3.0;
      fVar286 = fVar286 * 3.0;
      fVar272 = (fVar289 * fVar288 + fVar272) - fVar431;
      fVar344 = (fVar289 * fVar359 + fVar344) - fVar433;
      fVar274 = (fVar288 * 3.0 - fVar274) * fVar290 + fVar274;
      fVar286 = (fVar359 * 3.0 - fVar286) * fVar290 + fVar286;
      auVar250._0_8_ = CONCAT44(fVar274,fVar272) ^ 0x80000000;
      auVar250._8_4_ = fVar274;
      auVar250._12_4_ = fVar274;
      fVar384 = local_518.lower - fVar289;
      fVar400 = (float)local_538._0_4_ - fVar290;
      fVar404 = local_518.upper - fVar294;
      fVar415 = (float)local_538._4_4_ - fVar296;
      fVar419 = local_518.upper - fVar289;
      fVar421 = (float)local_538._4_4_ - fVar290;
      fVar423 = fVar423 - fVar294;
      fVar252 = fVar252 - fVar296;
      fVar431 = fVar272 * fVar290 + fVar431;
      fVar433 = fVar344 * fVar290 + fVar433;
      auVar271._0_8_ = CONCAT44(fVar286,fVar344) ^ 0x8000000000000000;
      auVar271._8_4_ = -fVar286;
      auVar271._12_4_ = -fVar286;
      auVar157._0_4_ = fVar344 * fVar274 - fVar286 * fVar272;
      auVar157._4_4_ = auVar157._0_4_;
      auVar157._8_4_ = auVar157._0_4_;
      auVar157._12_4_ = auVar157._0_4_;
      auVar256 = divps(auVar271,auVar157);
      auVar126 = divps(auVar250,auVar157);
      fVar294 = auVar256._0_4_;
      fVar296 = auVar256._4_4_;
      fVar288 = auVar126._0_4_;
      fVar359 = auVar126._4_4_;
      fVar289 = fVar289 - (fVar433 * fVar288 + fVar431 * fVar294);
      fVar274 = fVar290 - (fVar433 * fVar359 + fVar431 * fVar296);
      fVar286 = fVar290 - (fVar433 * auVar126._8_4_ + fVar431 * auVar256._8_4_);
      fVar290 = fVar290 - (fVar433 * auVar126._12_4_ + fVar431 * auVar256._12_4_);
      auVar193._0_8_ = CONCAT44(fVar296 * fVar380,fVar296 * fVar399);
      auVar193._8_4_ = fVar296 * fVar443;
      auVar193._12_4_ = fVar296 * fVar383;
      auVar158._0_4_ = fVar296 * fVar297;
      auVar158._4_4_ = fVar296 * fVar396;
      auVar158._8_4_ = fVar296 * fVar313;
      auVar158._12_4_ = fVar296 * fVar387;
      auVar448._8_4_ = auVar193._8_4_;
      auVar448._0_8_ = auVar193._0_8_;
      auVar448._12_4_ = auVar193._12_4_;
      auVar125 = minps(auVar448,auVar158);
      auVar126 = maxps(auVar158,auVar193);
      auVar281._0_8_ = CONCAT44(fVar359 * fVar383,fVar359 * fVar443);
      auVar281._8_4_ = fVar359 * fVar450;
      auVar281._12_4_ = fVar359 * fVar381;
      auVar194._0_4_ = fVar359 * fVar313;
      auVar194._4_4_ = fVar359 * fVar387;
      auVar194._8_4_ = fVar359 * fVar377;
      auVar194._12_4_ = fVar359 * fVar251;
      auVar372._8_4_ = auVar281._8_4_;
      auVar372._0_8_ = auVar281._0_8_;
      auVar372._12_4_ = auVar281._12_4_;
      auVar185 = minps(auVar372,auVar194);
      auVar256 = maxps(auVar194,auVar281);
      fVar431 = 0.0 - (auVar256._0_4_ + auVar126._0_4_);
      fVar433 = 1.0 - (auVar256._4_4_ + auVar126._4_4_);
      fVar272 = 0.0 - (auVar256._8_4_ + auVar126._8_4_);
      fVar344 = 0.0 - (auVar256._12_4_ + auVar126._12_4_);
      fVar368 = 0.0 - (auVar185._0_4_ + auVar125._0_4_);
      fVar314 = 1.0 - (auVar185._4_4_ + auVar125._4_4_);
      fVar363 = 0.0 - (auVar185._8_4_ + auVar125._8_4_);
      fVar364 = 0.0 - (auVar185._12_4_ + auVar125._12_4_);
      auVar195._0_8_ = CONCAT44(fVar400 * fVar433,fVar384 * fVar431);
      auVar195._8_4_ = fVar404 * fVar272;
      auVar195._12_4_ = fVar415 * fVar344;
      auVar390._0_8_ = CONCAT44(fVar380 * fVar294,fVar399 * fVar294);
      auVar390._8_4_ = fVar443 * fVar294;
      auVar390._12_4_ = fVar383 * fVar294;
      auVar282._0_4_ = fVar294 * fVar297;
      auVar282._4_4_ = fVar294 * fVar396;
      auVar282._8_4_ = fVar294 * fVar313;
      auVar282._12_4_ = fVar294 * fVar387;
      auVar373._8_4_ = auVar390._8_4_;
      auVar373._0_8_ = auVar390._0_8_;
      auVar373._12_4_ = auVar390._12_4_;
      auVar256 = minps(auVar373,auVar282);
      auVar126 = maxps(auVar282,auVar390);
      auVar323._0_8_ = CONCAT44(fVar383 * fVar288,fVar443 * fVar288);
      auVar323._8_4_ = fVar450 * fVar288;
      auVar323._12_4_ = fVar381 * fVar288;
      auVar391._0_4_ = fVar288 * fVar313;
      auVar391._4_4_ = fVar288 * fVar387;
      auVar391._8_4_ = fVar288 * fVar377;
      auVar391._12_4_ = fVar288 * fVar251;
      auVar437._8_4_ = auVar323._8_4_;
      auVar437._0_8_ = auVar323._0_8_;
      auVar437._12_4_ = auVar323._12_4_;
      auVar125 = minps(auVar437,auVar391);
      auVar374._0_4_ = fVar384 * fVar368;
      auVar374._4_4_ = fVar400 * fVar314;
      auVar374._8_4_ = fVar404 * fVar363;
      auVar374._12_4_ = fVar415 * fVar364;
      auVar159._0_8_ = CONCAT44(fVar433 * fVar421,fVar431 * fVar419);
      auVar159._8_4_ = fVar272 * fVar423;
      auVar159._12_4_ = fVar344 * fVar252;
      auVar291._0_4_ = fVar368 * fVar419;
      auVar291._4_4_ = fVar314 * fVar421;
      auVar291._8_4_ = fVar363 * fVar423;
      auVar291._12_4_ = fVar364 * fVar252;
      auVar185 = maxps(auVar391,auVar323);
      fVar251 = 1.0 - (auVar185._0_4_ + auVar126._0_4_);
      fVar431 = 0.0 - (auVar185._4_4_ + auVar126._4_4_);
      fVar433 = 0.0 - (auVar185._8_4_ + auVar126._8_4_);
      fVar272 = 0.0 - (auVar185._12_4_ + auVar126._12_4_);
      fVar344 = 1.0 - (auVar125._0_4_ + auVar256._0_4_);
      fVar297 = 0.0 - (auVar125._4_4_ + auVar256._4_4_);
      fVar368 = 0.0 - (auVar125._8_4_ + auVar256._8_4_);
      fVar313 = 0.0 - (auVar125._12_4_ + auVar256._12_4_);
      auVar324._0_8_ = CONCAT44(fVar400 * fVar431,fVar384 * fVar251);
      auVar324._8_4_ = fVar404 * fVar433;
      auVar324._12_4_ = fVar415 * fVar272;
      auVar411._0_4_ = fVar384 * fVar344;
      auVar411._4_4_ = fVar400 * fVar297;
      auVar411._8_4_ = fVar404 * fVar368;
      auVar411._12_4_ = fVar415 * fVar313;
      auVar283._0_8_ = CONCAT44(fVar431 * fVar421,fVar251 * fVar419);
      auVar283._8_4_ = fVar433 * fVar423;
      auVar283._12_4_ = fVar272 * fVar252;
      auVar355._0_4_ = fVar344 * fVar419;
      auVar355._4_4_ = fVar297 * fVar421;
      auVar355._8_4_ = fVar368 * fVar423;
      auVar355._12_4_ = fVar313 * fVar252;
      auVar392._8_4_ = auVar324._8_4_;
      auVar392._0_8_ = auVar324._0_8_;
      auVar392._12_4_ = auVar324._12_4_;
      auVar126 = minps(auVar392,auVar411);
      auVar429._8_4_ = auVar283._8_4_;
      auVar429._0_8_ = auVar283._0_8_;
      auVar429._12_4_ = auVar283._12_4_;
      auVar256 = minps(auVar429,auVar355);
      auVar350 = minps(auVar126,auVar256);
      auVar256 = maxps(auVar411,auVar324);
      auVar126 = maxps(auVar355,auVar283);
      auVar185 = maxps(auVar126,auVar256);
      auVar325._8_4_ = auVar195._8_4_;
      auVar325._0_8_ = auVar195._0_8_;
      auVar325._12_4_ = auVar195._12_4_;
      auVar256 = minps(auVar325,auVar374);
      auVar284._8_4_ = auVar159._8_4_;
      auVar284._0_8_ = auVar159._0_8_;
      auVar284._12_4_ = auVar159._12_4_;
      auVar126 = minps(auVar284,auVar291);
      auVar256 = minps(auVar256,auVar126);
      auVar125 = maxps(auVar374,auVar195);
      auVar126 = maxps(auVar291,auVar159);
      auVar126 = maxps(auVar126,auVar125);
      auVar326._0_4_ = auVar350._4_4_ + auVar350._0_4_ + fVar289;
      auVar326._4_4_ = auVar256._4_4_ + auVar256._0_4_ + fVar274;
      auVar326._8_4_ = auVar350._8_4_ + auVar350._4_4_ + fVar286;
      auVar326._12_4_ = auVar350._12_4_ + auVar256._4_4_ + fVar290;
      fVar251 = auVar185._4_4_ + auVar185._0_4_ + fVar289;
      fVar252 = auVar126._4_4_ + auVar126._0_4_ + fVar274;
      auVar160._4_4_ = fVar252;
      auVar160._0_4_ = fVar251;
      auVar191 = maxps(_local_508,auVar326);
      auVar160._8_4_ = auVar185._8_4_ + auVar185._4_4_ + fVar286;
      auVar160._12_4_ = auVar185._12_4_ + auVar126._4_4_ + fVar290;
      auVar126 = minps(auVar160,auVar311);
      iVar205 = -(uint)(auVar126._0_4_ < auVar191._0_4_);
      iVar235 = -(uint)(auVar126._4_4_ < auVar191._4_4_);
      auVar161._4_4_ = iVar235;
      auVar161._0_4_ = iVar205;
      auVar161._8_4_ = iVar235;
      auVar161._12_4_ = iVar235;
      auVar163._8_8_ = auVar161._8_8_;
      auVar163._4_4_ = (float)iVar205;
      auVar163._0_4_ = (float)iVar205;
      iVar205 = movmskpd((uint)(fVar241 < 0.0),auVar163);
      auVar153 = _local_508;
      if (iVar205 == 0) {
        bVar105 = 0;
        if ((local_518.lower < auVar326._0_4_) && (fVar251 < local_518.upper)) {
          bVar105 = -(fVar252 < (float)local_538._4_4_) & (float)local_538._0_4_ < auVar326._4_4_;
        }
        bVar105 = bVar104 | bVar105;
        uVar108 = (ulong)CONCAT31(uVar43,bVar105);
        if (bVar105 != 1) goto LAB_003b48dc;
        uVar109 = 0xc9;
        do {
          uVar109 = uVar109 - 1;
          if (uVar109 == 0) goto LAB_003b4f40;
          fVar252 = 1.0 - fVar289;
          fVar241 = fVar289 * fVar289 * fVar289;
          fVar433 = fVar289 * fVar289 * 3.0 * fVar252;
          fVar251 = fVar252 * fVar252 * fVar252;
          fVar272 = fVar289 * 3.0 * fVar252 * fVar252;
          fVar252 = fVar251 * fVar442 + fVar272 * fVar360 + fVar433 * fVar398 + fVar241 * fVar343;
          fVar423 = fVar251 * fVar449 + fVar272 * fVar402 + fVar433 * fVar414 + fVar241 * fVar361;
          fVar431 = fVar251 * p00_1.field_0.v[2] +
                    fVar272 * fVar334 + fVar433 * fVar330 + fVar241 * fVar242;
          fVar433 = fVar251 * p00_1.field_0.v[3] +
                    fVar272 * fVar379 + fVar433 * fVar336 + fVar241 * fVar240;
          fVar241 = (fVar431 - fVar252) * fVar274;
          fVar272 = (fVar433 - fVar423) * fVar274;
          fVar251 = (fVar431 - fVar252) * fVar274 + fVar252;
          fVar431 = (fVar433 - fVar423) * fVar274 + fVar423;
          fVar289 = fVar289 - (fVar431 * fVar288 + fVar251 * fVar294);
          fVar274 = fVar274 - (fVar431 * fVar359 + fVar251 * fVar296);
          fVar433 = ABS(fVar431);
          auVar163._0_8_ = CONCAT44(fVar431,fVar251) & 0x7fffffff7fffffff;
          auVar163._8_4_ = ABS(fVar241 + fVar252);
          auVar163._12_4_ = ABS(fVar272 + fVar423);
          auVar191._0_8_ = CONCAT44(fVar431,fVar431) & 0x7fffffff7fffffff;
          auVar191._8_4_ = (int)fVar433;
          auVar191._12_4_ = (int)fVar433;
          if (fVar433 <= ABS(fVar251)) {
            auVar191._0_4_ = ABS(fVar251);
          }
        } while (fVar238 <= auVar191._0_4_);
        if ((((0.0 <= fVar289) && (fVar289 <= 1.0)) &&
            (auVar163._4_4_ = fVar274, auVar163._0_4_ = fVar274, auVar163._8_4_ = fVar274,
            auVar163._12_4_ = fVar274, 0.0 <= fVar274)) && (fVar274 <= 1.0)) {
          fVar251 = pre->ray_space[k].vx.field_0.m128[2];
          fVar252 = pre->ray_space[k].vy.field_0.m128[2];
          fVar423 = pre->ray_space[k].vz.field_0.m128[2];
          auVar196._0_4_ = fVar315 * fVar251;
          auVar196._4_4_ = fVar327 * fVar252;
          auVar196._8_4_ = fVar393 * fVar423;
          auVar196._12_4_ =
               (((fVar273 - fVar273 * (fVar417 * fVar339 - fVar339 * fVar417) * fVar367) * fVar295 +
                (fVar366 - fVar366 * (fVar451 * fVar397 - fVar397 * fVar451) * fVar376) * fVar203) -
               0.0) * 0.0;
          auVar197._8_8_ = auVar196._8_8_;
          auVar197._0_8_ = auVar197._8_8_;
          auVar191._4_12_ = auVar197._4_12_;
          fVar286 = 1.0 - fVar274;
          fVar344 = 1.0 - fVar289;
          fVar431 = fVar344 * fVar344 * fVar344;
          fVar433 = fVar289 * 3.0 * fVar344 * fVar344;
          fVar272 = fVar289 * fVar289 * fVar289;
          fVar241 = fVar289 * fVar289 * 3.0 * fVar344;
          auVar191._0_4_ =
               ((auVar196._8_4_ + auVar196._4_4_ + auVar196._0_4_) * fVar286 +
               (fVar328 * fVar423 + fVar316 * fVar252 + fVar453 * fVar251) * fVar274) * fVar431 +
               ((fVar356 * fVar423 + fVar341 * fVar252 + fVar333 * fVar251) * fVar286 +
               (fVar382 * fVar423 + fVar365 * fVar252 + fVar329 * fVar251) * fVar274) * fVar433 +
               ((fVar418 * fVar423 + fVar403 * fVar252 + fVar395 * fVar251) * fVar286 +
               (fVar338 * fVar423 + fVar332 * fVar252 + fVar394 * fVar251) * fVar274) * fVar241 +
               (fVar286 * (fVar386 * fVar423 + fVar358 * fVar252 + fVar342 * fVar251) +
               (fVar423 * fVar207 + fVar252 * fVar201 + fVar251 * fVar168) * fVar274) * fVar272;
          if ((fVar243 <= auVar191._0_4_) &&
             (fVar251 = *(float *)(pRVar115 + k * 4 + 0x80), auVar191._0_4_ <= fVar251)) {
            fVar288 = 1.0 - fVar274;
            fVar359 = 1.0 - fVar274;
            fVar290 = 1.0 - fVar274;
            fVar252 = fVar385 * fVar288 + fVar420 * fVar274;
            fVar423 = fVar331 * fVar359 + fVar422 * fVar274;
            fVar286 = fVar337 * fVar290 + fVar430 * fVar274;
            fVar294 = fVar412 * fVar288 + fVar287 * fVar274;
            fVar297 = fVar254 * fVar359 + fVar206 * fVar274;
            fVar313 = fVar255 * fVar290 + fVar312 * fVar274;
            fVar296 = fVar294 - fVar252;
            fVar368 = fVar297 - fVar423;
            fVar314 = fVar313 - fVar286;
            fVar252 = (((fVar252 - (fVar335 * fVar288 + fVar253 * fVar274)) * fVar344 +
                       fVar289 * fVar296) * fVar344 +
                      (fVar296 * fVar344 +
                      ((fVar288 * fVar340 + fVar432 * fVar274) - fVar294) * fVar289) * fVar289) *
                      3.0;
            fVar423 = (((fVar423 - (fVar375 * fVar359 + fVar401 * fVar274)) * fVar344 +
                       fVar289 * fVar368) * fVar344 +
                      (fVar368 * fVar344 +
                      ((fVar359 * fVar357 + fVar440 * fVar274) - fVar297) * fVar289) * fVar289) *
                      3.0;
            fVar344 = (((fVar286 - (fVar378 * fVar290 + fVar292 * fVar274)) * fVar344 +
                       fVar289 * fVar314) * fVar344 +
                      (fVar314 * fVar344 +
                      ((fVar290 * fVar362 + fVar413 * fVar274) - fVar313) * fVar289) * fVar289) *
                      3.0;
            pGVar26 = (context->scene->geometries).items[uVar118].ptr;
            if ((pGVar26->mask & *(uint *)(pRVar115 + k * 4 + 0x90)) == 0) {
              uVar109 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (uVar109 = CONCAT71((int7)((ulong)context->args >> 8),1),
                    pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar274 = fVar431 * (fVar253 - fVar335) +
                        fVar433 * (fVar420 - fVar385) +
                        fVar241 * (fVar287 - fVar412) + fVar272 * (fVar432 - fVar340);
              fVar286 = fVar431 * (fVar401 - fVar375) +
                        fVar433 * (fVar422 - fVar331) +
                        fVar241 * (fVar206 - fVar254) + fVar272 * (fVar440 - fVar357);
              fVar431 = fVar431 * (fVar292 - fVar378) +
                        fVar433 * (fVar430 - fVar337) +
                        fVar241 * (fVar312 - fVar255) + fVar272 * (fVar413 - fVar362);
              local_c8 = fVar286 * fVar252 - fVar423 * fVar274;
              local_e8 = fVar431 * fVar423 - fVar344 * fVar286;
              local_d8 = fVar274 * fVar344 - fVar252 * fVar431;
              fStack_e4 = local_e8;
              fStack_e0 = local_e8;
              fStack_dc = local_e8;
              fStack_d4 = local_d8;
              fStack_d0 = local_d8;
              fStack_cc = local_d8;
              fStack_c4 = local_c8;
              fStack_c0 = local_c8;
              fStack_bc = local_c8;
              local_b8 = fVar289;
              fStack_b4 = fVar289;
              fStack_b0 = fVar289;
              fStack_ac = fVar289;
              local_a8 = auVar163;
              local_98 = CONCAT44(uVar119,uVar119);
              uStack_90 = CONCAT44(uVar119,uVar119);
              local_88 = CONCAT44(uVar118,uVar118);
              uStack_80 = CONCAT44(uVar118,uVar118);
              local_78 = context->user->instID[0];
              uStack_74 = local_78;
              uStack_70 = local_78;
              uStack_6c = local_78;
              local_68 = context->user->instPrimID[0];
              uStack_64 = local_68;
              uStack_60 = local_68;
              uStack_5c = local_68;
              *(float *)(pRVar115 + k * 4 + 0x80) = auVar191._0_4_;
              local_3a8 = *local_398;
              args.valid = (int *)local_3a8;
              args.geometryUserPtr = pGVar26->userPtr;
              args.context = context->user;
              args.ray = (RTCRayN *)pRVar115;
              args.hit = (RTCHitN *)&local_e8;
              args.N = 4;
              p_Var110 = pGVar26->occlusionFilterN;
              if (p_Var110 != (RTCFilterFunctionN)0x0) {
                p_Var110 = (RTCFilterFunctionN)(*p_Var110)(&args);
                pRVar115 = local_4f8;
              }
              auVar198._0_4_ = -(uint)(local_3a8._0_4_ == 0);
              auVar198._4_4_ = -(uint)(local_3a8._4_4_ == 0);
              auVar198._8_4_ = -(uint)(local_3a8._8_4_ == 0);
              auVar198._12_4_ = -(uint)(local_3a8._12_4_ == 0);
              uVar106 = movmskps((int)p_Var110,auVar198);
              pRVar111 = (RTCRayN *)(ulong)(uVar106 ^ 0xf);
              if ((uVar106 ^ 0xf) == 0) {
                auVar198 = auVar198 ^ _DAT_01f46b70;
                auVar163 = local_3a8;
              }
              else {
                p_Var110 = context->args->filter;
                if ((p_Var110 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar26->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var110)(&args);
                  pRVar115 = local_4f8;
                }
                auVar162._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                auVar162._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                auVar162._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                auVar162._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                auVar198 = auVar162 ^ _DAT_01f46b70;
                auVar163 = ~auVar162 & _DAT_01f45a40 |
                           *(undefined1 (*) [16])(args.ray + 0x80) & auVar162;
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar163;
                pRVar111 = args.ray;
              }
              auVar191._0_4_ = (float)(auVar198._0_4_ << 0x1f);
              auVar191._4_4_ = auVar198._4_4_ << 0x1f;
              auVar191._8_4_ = auVar198._8_4_ << 0x1f;
              auVar191._12_4_ = auVar198._12_4_ << 0x1f;
              iVar205 = movmskps((int)pRVar111,auVar191);
              uVar109 = (ulong)CONCAT31((int3)((uint)iVar205 >> 8),iVar205 != 0);
              if (iVar205 == 0) {
                *(float *)(pRVar115 + k * 4 + 0x80) = fVar251;
              }
            }
            bVar112 = bVar112 | (byte)uVar109;
          }
        }
      }
    }
  }
  goto LAB_003b4f40;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }